

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::NewFrame(void)

{
  ImVector<ImGuiContextHook> *this;
  ImGuiNextWindowData *pIVar1;
  ImS8 *pIVar2;
  ImRect *pIVar3;
  ImVec2 *pIVar4;
  ImU16 *pIVar5;
  ImVec2 IVar6;
  double dVar7;
  ImVec2 IVar8;
  ImGuiNavLayer IVar9;
  ImGuiContextHook *pIVar10;
  char *pcVar11;
  ImGuiViewportP *pIVar12;
  ImGuiTableTempData *pIVar13;
  ImGuiStackLevelInfo *pIVar14;
  ImVec4 IVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  ulong uVar18;
  ulong uVar19;
  undefined1 auVar20 [16];
  ImGuiScrollFlags scroll_flags;
  ImVec4 IVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  ImGuiNavDirSourceFlags dir_sources;
  undefined1 auVar25 [12];
  undefined1 auVar26 [16];
  ImGuiContext *ctx;
  ImGuiContext *pIVar27;
  bool bVar28;
  bool bVar29;
  int n_2;
  uint uVar30;
  ImGuiID IVar31;
  ImGuiKeyModFlags IVar32;
  ImGuiInputSource IVar33;
  ImGuiNavLayer layer;
  ImGuiDir IVar34;
  ImGuiDir IVar35;
  ImFont *font;
  ImGuiWindow *pIVar36;
  ImGuiContext *pIVar37;
  byte bVar38;
  int i;
  int iVar39;
  ImGuiID IVar40;
  uint uVar41;
  undefined4 uVar42;
  ImGuiWindow *pIVar43;
  ImGuiWindow *window;
  uint uVar44;
  ImGuiContext *g_2;
  bool *pbVar45;
  ImGuiContext *g;
  long lVar46;
  ImGuiContext *pIVar47;
  ImGuiWindow *old_nav_window;
  ulong uVar48;
  long lVar49;
  bool bVar50;
  bool bVar51;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [64];
  undefined1 auVar57 [64];
  undefined1 auVar61 [48];
  undefined1 auVar59 [64];
  float fVar62;
  float fVar63;
  float fVar64;
  undefined8 uVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined8 uVar94;
  undefined1 auVar95 [56];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 extraout_var [56];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  float fVar96;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar107 [56];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  ImRect IVar123;
  float local_88;
  undefined1 local_78 [8];
  ImVec2 IStack_70;
  undefined4 local_5c;
  undefined1 local_58 [16];
  ImRect local_48;
  undefined1 auVar52 [16];
  undefined1 auVar56 [64];
  undefined1 auVar58 [64];
  undefined1 auVar60 [64];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 auVar102 [64];
  
  ctx = GImGui;
  uVar48 = (ulong)(uint)(GImGui->Hooks).Size;
  this = &GImGui->Hooks;
  lVar46 = uVar48 << 5;
  while( true ) {
    if ((int)uVar48 < 1) break;
    pIVar10 = (ctx->Hooks).Data;
    if (*(int *)(pIVar10 + lVar46 + -0x1c) == 7) {
      ImVector<ImGuiContextHook>::erase(this,pIVar10 + lVar46 + -0x20);
    }
    uVar48 = (ulong)((int)uVar48 - 1);
    lVar46 = lVar46 + -0x20;
  }
  CallContextHooks(ctx,ImGuiContextHookType_NewFramePre);
  pIVar47 = GImGui;
  if (((GImGui->IO).ConfigWindowsResizeFromEdges == true) && (((GImGui->IO).BackendFlags & 2) == 0))
  {
    (GImGui->IO).ConfigWindowsResizeFromEdges = false;
  }
  if (pIVar47->SettingsLoaded == false) {
    pcVar11 = (pIVar47->IO).IniFilename;
    if (pcVar11 != (char *)0x0) {
      LoadIniSettingsFromDisk(pcVar11);
    }
    pIVar47->SettingsLoaded = true;
  }
  if ((0.0 < pIVar47->SettingsDirtyTimer) &&
     (fVar96 = pIVar47->SettingsDirtyTimer - (pIVar47->IO).DeltaTime,
     pIVar47->SettingsDirtyTimer = fVar96, fVar96 <= 0.0)) {
    pcVar11 = (pIVar47->IO).IniFilename;
    if (pcVar11 == (char *)0x0) {
      (pIVar47->IO).WantSaveIniSettings = true;
    }
    else {
      SaveIniSettingsToDisk(pcVar11);
    }
    pIVar47->SettingsDirtyTimer = 0.0;
  }
  lVar46 = 0;
  ctx->Time = (double)(ctx->IO).DeltaTime + ctx->Time;
  ctx->WithinFrameScope = true;
  ctx->FrameCount = ctx->FrameCount + 1;
  ctx->TooltipOverrideCount = 0;
  ctx->WindowsActiveCount = 0;
  ImVector<unsigned_int>::resize(&ctx->MenusIdSubmittedThisFrame,0);
  iVar39 = ctx->FramerateSecPerFrameIdx;
  fVar96 = (ctx->IO).DeltaTime;
  ctx->FramerateSecPerFrameAccum =
       (fVar96 - ctx->FramerateSecPerFrame[iVar39]) + ctx->FramerateSecPerFrameAccum;
  ctx->FramerateSecPerFrame[iVar39] = fVar96;
  ctx->FramerateSecPerFrameIdx = (iVar39 + 1) % 0x78;
  iVar39 = 0x77;
  if (ctx->FramerateSecPerFrameCount < 0x77) {
    iVar39 = ctx->FramerateSecPerFrameCount;
  }
  ctx->FramerateSecPerFrameCount = iVar39 + 1;
  uVar65 = vcmpss_avx512f(ZEXT416((uint)ctx->FramerateSecPerFrameAccum),ZEXT416(0),0xe);
  bVar51 = (bool)((byte)uVar65 & 1);
  local_58 = SUB6416(ZEXT464(0x7f7fffff),0);
  fVar96 = 1.0 / (ctx->FramerateSecPerFrameAccum / (float)(iVar39 + 1));
  auVar102 = ZEXT464((uint)fVar96);
  (ctx->IO).Framerate = (float)((uint)bVar51 * (int)fVar96 + (uint)!bVar51 * 0x7f7fffff);
  pIVar47 = GImGui;
  pIVar12 = *(GImGui->Viewports).Data;
  (pIVar12->super_ImGuiViewport).Flags = 5;
  (pIVar12->super_ImGuiViewport).Pos.x = 0.0;
  (pIVar12->super_ImGuiViewport).Pos.y = 0.0;
  (pIVar12->super_ImGuiViewport).Size = (pIVar47->IO).DisplaySize;
  for (; lVar46 < (pIVar47->Viewports).Size; lVar46 = lVar46 + 1) {
    pIVar12 = (pIVar47->Viewports).Data[lVar46];
    pIVar12->WorkOffsetMin = pIVar12->BuildWorkOffsetMin;
    pIVar12->WorkOffsetMax = pIVar12->BuildWorkOffsetMax;
    uVar65 = SUB168(ZEXT816(0) << 0x20,0);
    uVar94 = SUB168(ZEXT816(0) << 0x20,8);
    (pIVar12->BuildWorkOffsetMin).x = (float)(int)uVar65;
    (pIVar12->BuildWorkOffsetMin).y = (float)(int)((ulong)uVar65 >> 0x20);
    (pIVar12->BuildWorkOffsetMax).x = (float)(int)uVar94;
    (pIVar12->BuildWorkOffsetMax).y = (float)(int)((ulong)uVar94 >> 0x20);
    ImGuiViewportP::UpdateWorkRect(pIVar12);
  }
  ((ctx->IO).Fonts)->Locked = true;
  font = GetDefaultFont();
  SetCurrentFont(font);
  lVar46 = 0;
  IVar21 = _DAT_004cd500;
  while( true ) {
    auVar107 = auVar102._8_56_;
    auVar95 = ZEXT856(IVar21._8_8_);
    if ((ctx->Viewports).Size <= lVar46) break;
    IVar123 = ImGuiViewportP::GetMainRect((ctx->Viewports).Data[lVar46]);
    auVar102._0_8_ = IVar123.Max;
    auVar102._8_56_ = auVar107;
    auVar86._0_8_ = IVar123.Min;
    auVar86._8_56_ = auVar95;
    auVar66 = auVar86._0_16_;
    auVar52 = vminps_avx(auVar66,(undefined1  [16])IVar21);
    uVar48 = vcmpps_avx512vl(auVar66,(undefined1  [16])IVar21,1);
    auVar108._0_4_ = auVar52._0_4_;
    auVar108._4_12_ = IVar21._4_12_;
    auVar52 = vblendmps_avx512vl(auVar108,auVar66);
    bVar51 = (bool)((byte)uVar48 & 1);
    auVar53._0_4_ = (uint)bVar51 * auVar52._0_4_ | (uint)!bVar51 * (int)IVar123.Min.x;
    bVar51 = (bool)((byte)(uVar48 >> 1) & 1);
    auVar53._4_4_ = (uint)bVar51 * auVar52._4_4_ | (uint)!bVar51 * (int)IVar123.Min.y;
    bVar51 = (bool)((byte)(uVar48 >> 2) & 1);
    auVar53._8_4_ = (uint)bVar51 * auVar52._8_4_ | (uint)!bVar51 * auVar95._0_4_;
    bVar51 = (bool)((byte)(uVar48 >> 3) & 1);
    auVar53._12_4_ = (uint)bVar51 * auVar52._12_4_ | (uint)!bVar51 * auVar95._4_4_;
    IVar15 = (ImVec4)vblendps_avx(auVar108,auVar53,2);
    auVar52 = vshufpd_avx((undefined1  [16])IVar21,(undefined1  [16])IVar21,1);
    auVar66 = auVar102._0_16_;
    if (auVar52._0_4_ < IVar123.Max.x) {
      IVar15 = (ImVec4)vinsertps_avx((undefined1  [16])IVar15,auVar66,0x20);
    }
    auVar67 = vshufps_avx((undefined1  [16])IVar15,(undefined1  [16])IVar15,0xff);
    auVar52 = vmovshdup_avx(auVar66);
    if (auVar67._0_4_ < auVar52._0_4_) {
      IVar15 = (ImVec4)vinsertps_avx((undefined1  [16])IVar15,auVar66,0x70);
    }
    lVar46 = lVar46 + 1;
    IVar21 = IVar15;
  }
  (ctx->DrawListSharedData).ClipRectFullscreen = IVar21;
  fVar96 = (ctx->Style).CircleTessellationMaxError;
  (ctx->DrawListSharedData).CurveTessellationTol = (ctx->Style).CurveTessellationTol;
  ImDrawListSharedData::SetCircleTessellationMaxError(&ctx->DrawListSharedData,fVar96);
  bVar51 = (ctx->Style).AntiAliasedLines;
  uVar30 = (uint)bVar51;
  (ctx->DrawListSharedData).InitialFlags = (uint)bVar51;
  if (((ctx->Style).AntiAliasedLinesUseTex != false) &&
     ((ctx->Font->ContainerAtlas->Flags & 4) == 0)) {
    uVar30 = bVar51 | 2;
    (ctx->DrawListSharedData).InitialFlags = uVar30;
  }
  if ((ctx->Style).AntiAliasedFill == true) {
    uVar30 = uVar30 | 4;
    (ctx->DrawListSharedData).InitialFlags = uVar30;
  }
  if (((ctx->IO).BackendFlags & 8) != 0) {
    (ctx->DrawListSharedData).InitialFlags = uVar30 | 8;
  }
  for (lVar46 = 0; lVar46 < (ctx->Viewports).Size; lVar46 = lVar46 + 1) {
    pIVar12 = (ctx->Viewports).Data[lVar46];
    (pIVar12->DrawDataP).CmdLists = (ImDrawList **)0x0;
    (pIVar12->DrawDataP).DisplayPos.x = 0.0;
    (pIVar12->DrawDataP).DisplayPos.y = 0.0;
    (pIVar12->DrawDataP).DisplaySize.x = 0.0;
    (pIVar12->DrawDataP).DisplaySize.y = 0.0;
    (pIVar12->DrawDataP).FramebufferScale.x = 0.0;
    (pIVar12->DrawDataP).FramebufferScale.y = 0.0;
    (pIVar12->DrawDataP).Valid = false;
    *(undefined3 *)&(pIVar12->DrawDataP).field_0x1 = 0;
    (pIVar12->DrawDataP).CmdListsCount = 0;
    (pIVar12->DrawDataP).TotalIdxCount = 0;
    (pIVar12->DrawDataP).TotalVtxCount = 0;
    (pIVar12->DrawDataP).CmdLists = (ImDrawList **)0x0;
    (pIVar12->DrawDataP).DisplayPos.x = 0.0;
    (pIVar12->DrawDataP).DisplayPos.y = 0.0;
  }
  if ((ctx->DragDropActive != false) &&
     (IVar40 = (ctx->DragDropPayload).SourceId, IVar40 == ctx->ActiveId)) {
    KeepAliveID(IVar40);
  }
  if (ctx->HoveredIdPreviousFrame == 0) {
    IVar40 = ctx->HoveredId;
    ctx->HoveredIdTimer = 0.0;
    ctx->HoveredIdNotActiveTimer = 0.0;
    if (IVar40 == 0) goto LAB_00257399;
LAB_00257376:
    fVar96 = (ctx->IO).DeltaTime;
    ctx->HoveredIdTimer = fVar96 + ctx->HoveredIdTimer;
    IVar31 = IVar40;
    if (ctx->ActiveId != IVar40) {
      ctx->HoveredIdNotActiveTimer = fVar96 + ctx->HoveredIdNotActiveTimer;
      IVar31 = ctx->ActiveId;
    }
  }
  else {
    IVar40 = ctx->HoveredId;
    if (IVar40 != 0) {
      if (ctx->ActiveId == IVar40) {
        ctx->HoveredIdNotActiveTimer = 0.0;
      }
      goto LAB_00257376;
    }
LAB_00257399:
    IVar40 = 0;
    IVar31 = ctx->ActiveId;
  }
  ctx->HoveredIdPreviousFrame = IVar40;
  ctx->HoveredIdPreviousFrameUsingMouseWheel = ctx->HoveredIdUsingMouseWheel;
  ctx->HoveredId = 0;
  ctx->HoveredIdAllowOverlap = false;
  ctx->HoveredIdUsingMouseWheel = false;
  ctx->HoveredIdDisabled = false;
  if (((ctx->ActiveIdIsAlive != IVar31) && (IVar31 != 0)) && (ctx->ActiveIdPreviousFrame == IVar31))
  {
    ClearActiveID();
    IVar31 = ctx->ActiveId;
  }
  fVar96 = (ctx->IO).DeltaTime;
  if (IVar31 != 0) {
    ctx->ActiveIdTimer = fVar96 + ctx->ActiveIdTimer;
  }
  ctx->LastActiveIdTimer = fVar96 + ctx->LastActiveIdTimer;
  ctx->ActiveIdPreviousFrame = IVar31;
  ctx->ActiveIdPreviousFrameWindow = ctx->ActiveIdWindow;
  ctx->ActiveIdPreviousFrameHasBeenEditedBefore = ctx->ActiveIdHasBeenEditedBefore;
  ctx->ActiveIdIsAlive = 0;
  ctx->ActiveIdHasBeenEditedThisFrame = false;
  ctx->ActiveIdPreviousFrameIsAlive = false;
  ctx->ActiveIdIsJustActivated = false;
  if (ctx->TempInputId == 0) {
LAB_00257476:
    if (IVar31 == 0) {
      auVar52._0_12_ = ZEXT812(0);
      auVar52._12_4_ = 0;
      ctx->ActiveIdUsingNavDirMask = auVar52._0_4_;
      ctx->ActiveIdUsingNavInputMask = auVar52._4_4_;
      ctx->ActiveIdUsingKeyInputMask = auVar52._8_8_;
    }
  }
  else if (IVar31 != ctx->TempInputId) {
    ctx->TempInputId = 0;
    goto LAB_00257476;
  }
  ctx->DragDropAcceptIdPrev = ctx->DragDropAcceptIdCurr;
  ctx->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
  ctx->DragDropAcceptIdCurr = 0;
  ctx->DragDropWithinSource = false;
  ctx->DragDropWithinTarget = false;
  ctx->DragDropHoldJustPressedId = 0;
  if ((ctx->IO).AppFocusLost == true) {
    ImGuiIO::ClearInputKeys(&ctx->IO);
    (ctx->IO).AppFocusLost = false;
  }
  IVar32 = GetMergedKeyModFlags();
  (ctx->IO).KeyMods = IVar32;
  memcpy((ctx->IO).KeysDownDurationPrev,(ctx->IO).KeysDownDuration,0x800);
  for (lVar46 = 0x144; pIVar47 = GImGui, lVar46 != 0x344; lVar46 = lVar46 + 1) {
    fVar96 = -1.0;
    if (*(char *)((long)(ctx->IO).KeyMap + lVar46 + -0x3c) == '\x01') {
      fVar62 = *(float *)((long)ctx + lVar46 * 4 + -0x5c);
      fVar96 = 0.0;
      if (0.0 <= fVar62) {
        fVar96 = fVar62 + (ctx->IO).DeltaTime;
      }
    }
    *(float *)((long)ctx + lVar46 * 4 + -0x5c) = fVar96;
  }
  (GImGui->IO).WantSetMousePos = false;
  uVar30 = (pIVar47->IO).ConfigFlags;
  if (((uVar30 & 2) == 0) || (((pIVar47->IO).BackendFlags & 1) == 0)) {
    bVar51 = false;
  }
  else {
    bVar51 = true;
    if ((pIVar47->NavInputSource != ImGuiInputSource_Gamepad) &&
       (((0.0 < (pIVar47->IO).NavInputs[0] || (0.0 < (pIVar47->IO).NavInputs[2])) ||
        ((0.0 < (pIVar47->IO).NavInputs[1] ||
         ((((0.0 < (pIVar47->IO).NavInputs[3] || (0.0 < (pIVar47->IO).NavInputs[4])) ||
           (0.0 < (pIVar47->IO).NavInputs[5])) ||
          ((0.0 < (pIVar47->IO).NavInputs[6] || (bVar51 = true, 0.0 < (pIVar47->IO).NavInputs[7]))))
         )))))) {
      pIVar47->NavInputSource = ImGuiInputSource_Gamepad;
      bVar51 = true;
    }
  }
  if ((uVar30 & 1) != 0) {
    lVar46 = (long)(pIVar47->IO).KeyMap[0xc];
    if ((-1 < lVar46) && ((pIVar47->IO).KeysDown[lVar46] == true)) {
      (pIVar47->IO).NavInputs[0] = 1.0;
      pIVar47->NavInputSource = ImGuiInputSource_Keyboard;
    }
    lVar46 = (long)(pIVar47->IO).KeyMap[0xd];
    if ((-1 < lVar46) && ((pIVar47->IO).KeysDown[lVar46] == true)) {
      (pIVar47->IO).NavInputs[2] = 1.0;
      pIVar47->NavInputSource = ImGuiInputSource_Keyboard;
    }
    lVar46 = (long)(pIVar47->IO).KeyMap[0xe];
    if ((-1 < lVar46) && ((pIVar47->IO).KeysDown[lVar46] == true)) {
      (pIVar47->IO).NavInputs[1] = 1.0;
      pIVar47->NavInputSource = ImGuiInputSource_Keyboard;
    }
    lVar46 = (long)(pIVar47->IO).KeyMap[1];
    if ((-1 < lVar46) && ((pIVar47->IO).KeysDown[lVar46] == true)) {
      (pIVar47->IO).NavInputs[0x10] = 1.0;
      pIVar47->NavInputSource = ImGuiInputSource_Keyboard;
    }
    lVar46 = (long)(pIVar47->IO).KeyMap[2];
    if ((-1 < lVar46) && ((pIVar47->IO).KeysDown[lVar46] == true)) {
      (pIVar47->IO).NavInputs[0x11] = 1.0;
      pIVar47->NavInputSource = ImGuiInputSource_Keyboard;
    }
    lVar46 = (long)(pIVar47->IO).KeyMap[3];
    if ((-1 < lVar46) && ((pIVar47->IO).KeysDown[lVar46] == true)) {
      (pIVar47->IO).NavInputs[0x12] = 1.0;
      pIVar47->NavInputSource = ImGuiInputSource_Keyboard;
    }
    lVar46 = (long)(pIVar47->IO).KeyMap[4];
    if ((-1 < lVar46) && ((pIVar47->IO).KeysDown[lVar46] == true)) {
      (pIVar47->IO).NavInputs[0x13] = 1.0;
      pIVar47->NavInputSource = ImGuiInputSource_Keyboard;
    }
    if ((pIVar47->IO).KeyCtrl == true) {
      (pIVar47->IO).NavInputs[0xe] = 1.0;
    }
    if ((pIVar47->IO).KeyShift == true) {
      (pIVar47->IO).NavInputs[0xf] = 1.0;
    }
  }
  auVar102 = *(undefined1 (*) [64])(pIVar47->IO).NavInputsDownDuration;
  auVar61 = auVar102._16_48_;
  uVar65 = *(undefined8 *)((pIVar47->IO).NavInputsDownDuration + 6);
  uVar94 = *(undefined8 *)((pIVar47->IO).NavInputsDownDuration + 8);
  uVar16 = *(undefined8 *)((pIVar47->IO).NavInputsDownDuration + 10);
  uVar17 = *(undefined8 *)((pIVar47->IO).NavInputsDownDuration + 0xc);
  uVar22 = *(undefined8 *)((pIVar47->IO).NavInputsDownDuration + 0xe);
  uVar23 = *(undefined8 *)((pIVar47->IO).NavInputsDownDuration + 0x10);
  uVar24 = *(undefined8 *)((pIVar47->IO).NavInputsDownDuration + 0x12);
  *(undefined8 *)((pIVar47->IO).NavInputsDownDurationPrev + 4) =
       *(undefined8 *)((pIVar47->IO).NavInputsDownDuration + 4);
  *(undefined8 *)((pIVar47->IO).NavInputsDownDurationPrev + 6) = uVar65;
  *(undefined8 *)((pIVar47->IO).NavInputsDownDurationPrev + 8) = uVar94;
  *(undefined8 *)((pIVar47->IO).NavInputsDownDurationPrev + 10) = uVar16;
  *(undefined8 *)((pIVar47->IO).NavInputsDownDurationPrev + 0xc) = uVar17;
  *(undefined8 *)((pIVar47->IO).NavInputsDownDurationPrev + 0xe) = uVar22;
  *(undefined8 *)((pIVar47->IO).NavInputsDownDurationPrev + 0x10) = uVar23;
  *(undefined8 *)((pIVar47->IO).NavInputsDownDurationPrev + 0x12) = uVar24;
  *(undefined1 (*) [64])(pIVar47->IO).NavInputsDownDurationPrev = auVar102;
  uVar48 = 0;
  for (lVar46 = 0; lVar46 != 0x14; lVar46 = lVar46 + 1) {
    fVar96 = -1.0;
    if (0.0 < (pIVar47->IO).NavInputs[lVar46]) {
      fVar62 = (pIVar47->IO).NavInputsDownDuration[lVar46];
      fVar96 = 0.0;
      if (0.0 <= fVar62) {
        fVar96 = fVar62 + (pIVar47->IO).DeltaTime;
      }
    }
    (pIVar47->IO).NavInputsDownDuration[lVar46] = fVar96;
  }
  if (pIVar47->NavInitResultId != 0) {
    uVar48 = 0;
    NavInitRequestApplyResult();
  }
  pIVar47->NavInitRequest = false;
  pIVar47->NavInitRequestFromMove = false;
  pIVar47->NavInitResultId = 0;
  pIVar47->NavJustMovedToId = 0;
  if (pIVar47->NavMoveSubmitted == true) {
    NavMoveRequestApplyResult();
  }
  pIVar47->NavTabbingCounter = 0;
  pIVar47->NavMoveSubmitted = false;
  pIVar47->NavMoveScoringItems = false;
  if ((((pIVar47->NavMousePosDirty == true) && (pIVar47->NavIdIsAlive == true)) &&
      (pIVar47->NavDisableHighlight == false)) && (pIVar47->NavDisableMouseHover == true)) {
    bVar50 = pIVar47->NavWindow != (ImGuiWindow *)0x0;
  }
  else {
    bVar50 = false;
  }
  pIVar47->NavMousePosDirty = false;
  pIVar36 = pIVar47->NavWindow;
  pIVar43 = pIVar36;
  if (pIVar36 != (ImGuiWindow *)0x0) {
    for (; pIVar43 != (ImGuiWindow *)0x0; pIVar43 = pIVar43->ParentWindow) {
      if ((pIVar43->RootWindow == pIVar43) || ((pIVar43->Flags & 0x14000000) != 0)) {
        if (pIVar43 != pIVar36) {
          pIVar43->NavLastChildNavWindow = pIVar36;
        }
        break;
      }
    }
    if ((pIVar36->NavLastChildNavWindow != (ImGuiWindow *)0x0) &&
       (pIVar47->NavLayer == ImGuiNavLayer_Main)) {
      pIVar36->NavLastChildNavWindow = (ImGuiWindow *)0x0;
    }
  }
  pIVar37 = GImGui;
  auVar95 = ZEXT856(uVar48);
  pIVar36 = GetTopMostPopupModal();
  if (pIVar36 != (ImGuiWindow *)0x0) {
    pIVar37->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((pIVar37->NavWindowingTargetAnim != (ImGuiWindow *)0x0) &&
     (pIVar37->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    auVar52 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1200000),0),ZEXT416((uint)(pIVar37->IO).DeltaTime),
                              ZEXT416((uint)pIVar37->NavWindowingHighlightAlpha));
    auVar66._0_12_ = ZEXT812(0);
    auVar66._12_4_ = 0;
    uVar65 = vcmpss_avx512f(auVar66,auVar52,2);
    fVar96 = (float)((uint)((byte)uVar65 & 1) * auVar52._0_4_);
    auVar95 = ZEXT856(auVar52._8_8_);
    pIVar37->NavWindowingHighlightAlpha = fVar96;
    if ((pIVar37->DimBgRatio <= 0.0) && (fVar96 <= 0.0)) {
      pIVar37->NavWindowingTargetAnim = (ImGuiWindow *)0x0;
    }
  }
  if ((pIVar36 == (ImGuiWindow *)0x0) && (pIVar37->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    bVar28 = IsNavInputTest(3,ImGuiInputReadMode_Pressed);
    if ((pIVar37->NavWindowingTarget != (ImGuiWindow *)0x0) || ((pIVar37->IO).KeyCtrl != true))
    goto LAB_002578a4;
    bVar29 = IsKeyPressedMap(0,true);
  }
  else {
    bVar28 = false;
LAB_002578a4:
    bVar29 = false;
  }
  if (((bVar28 | bVar29) == 1) &&
     ((pIVar36 = pIVar37->NavWindow, pIVar36 != (ImGuiWindow *)0x0 ||
      (pIVar36 = FindWindowNavFocusable((pIVar37->WindowsFocusOrder).Size + -1,-0x7fffffff,-1),
      pIVar36 != (ImGuiWindow *)0x0)))) {
    pIVar36 = pIVar36->RootWindow;
    pIVar37->NavWindowingTargetAnim = pIVar36;
    pIVar37->NavWindowingTarget = pIVar36;
    pIVar37->NavWindowingTimer = 0.0;
    pIVar37->NavWindowingHighlightAlpha = 0.0;
    pIVar37->NavWindowingToggleLayer = bVar28;
    pIVar37->NavInputSource = bVar29 ^ ImGuiInputSource_Gamepad;
  }
  fVar96 = (pIVar37->IO).DeltaTime + pIVar37->NavWindowingTimer;
  auVar107 = (undefined1  [56])0x0;
  pIVar37->NavWindowingTimer = fVar96;
  if (pIVar37->NavWindowingTarget == (ImGuiWindow *)0x0) {
LAB_00257a98:
    bVar38 = false;
    pIVar36 = (ImGuiWindow *)0x0;
  }
  else {
    IVar33 = pIVar37->NavInputSource;
    if (IVar33 != ImGuiInputSource_Gamepad) {
LAB_00257a07:
      auVar107 = (undefined1  [56])0x0;
      if (IVar33 == ImGuiInputSource_Keyboard) {
        auVar95 = (undefined1  [56])0x0;
        auVar68._0_4_ = (pIVar37->NavWindowingTimer + -0.2) / 0.05;
        auVar68._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar107 = ZEXT856(0);
        auVar52 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar68);
        uVar65 = vcmpss_avx512f(auVar68,ZEXT816(0) << 0x40,1);
        auVar58._16_48_ = auVar61;
        auVar58._0_16_ = auVar52;
        iVar39 = (uint)!(bool)((byte)uVar65 & 1) * auVar52._0_4_;
        auVar57._4_60_ = auVar58._4_60_;
        auVar57._0_4_ = iVar39;
        uVar65 = vcmpss_avx512f(auVar57._0_16_,ZEXT416((uint)pIVar37->NavWindowingHighlightAlpha),2)
        ;
        bVar28 = (bool)((byte)uVar65 & 1);
        pIVar37->NavWindowingHighlightAlpha =
             (float)((uint)bVar28 * (int)pIVar37->NavWindowingHighlightAlpha +
                    (uint)!bVar28 * iVar39);
        bVar28 = IsKeyPressedMap(0,true);
        if (bVar28) {
          NavUpdateWindowingHighlightWindow((pIVar37->IO).KeyShift - 1 | 1);
        }
        if ((pIVar37->IO).KeyCtrl == false) {
          pIVar36 = pIVar37->NavWindowingTarget;
          bVar38 = false;
          goto LAB_00257a9d;
        }
      }
      goto LAB_00257a98;
    }
    auVar95 = (undefined1  [56])0x0;
    auVar67._0_4_ = (fVar96 + -0.2) / 0.05;
    auVar67._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar52 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar67);
    uVar65 = vcmpss_avx512f(auVar67,ZEXT816(0) << 0x40,1);
    auVar56._16_48_ = auVar61;
    auVar56._0_16_ = auVar52;
    iVar39 = (uint)!(bool)((byte)uVar65 & 1) * auVar52._0_4_;
    auVar55._4_60_ = auVar56._4_60_;
    auVar55._0_4_ = iVar39;
    uVar65 = vcmpss_avx512f(auVar55._0_16_,ZEXT416((uint)pIVar37->NavWindowingHighlightAlpha),2);
    bVar28 = (bool)((byte)uVar65 & 1);
    pIVar37->NavWindowingHighlightAlpha =
         (float)((uint)bVar28 * (int)pIVar37->NavWindowingHighlightAlpha + (uint)!bVar28 * iVar39);
    bVar28 = IsNavInputTest(0xc,ImGuiInputReadMode_RepeatSlow);
    bVar29 = IsNavInputTest(0xd,ImGuiInputReadMode_RepeatSlow);
    if ((uint)bVar28 - (uint)bVar29 != 0) {
      NavUpdateWindowingHighlightWindow((uint)bVar28 - (uint)bVar29);
      pIVar37->NavWindowingHighlightAlpha = 1.0;
    }
    auVar107 = (undefined1  [56])0x0;
    if (0.0 < (GImGui->IO).NavInputs[3]) {
      if (pIVar37->NavWindowingTarget == (ImGuiWindow *)0x0) goto LAB_00257a98;
      IVar33 = pIVar37->NavInputSource;
      goto LAB_00257a07;
    }
    auVar107 = (undefined1  [56])0x0;
    pbVar45 = &pIVar37->NavWindowingToggleLayer;
    *pbVar45 = (bool)(*pbVar45 & pIVar37->NavWindowingHighlightAlpha < 1.0);
    if (*pbVar45 == false) {
      pIVar36 = pIVar37->NavWindowingTarget;
      bVar38 = false;
    }
    else {
      bVar38 = pIVar37->NavWindow != (ImGuiWindow *)0x0;
      pIVar36 = (ImGuiWindow *)0x0;
    }
    pIVar37->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
LAB_00257a9d:
  if (((((pIVar37->IO).ConfigFlags & 1) != 0) && ((pIVar37->IO).KeyMods == 4)) &&
     (((pIVar37->IO).KeyModsPrev & 4) == 0)) {
    pIVar37->NavWindowingToggleLayer = true;
    pIVar37->NavInputSource = ImGuiInputSource_Keyboard;
  }
  if ((pIVar37->NavWindowingToggleLayer == true) &&
     (pIVar37->NavInputSource == ImGuiInputSource_Keyboard)) {
    if (((0 < (pIVar37->IO).InputQueueCharacters.Size) ||
        (((pIVar37->IO).KeyCtrl != false || ((pIVar37->IO).KeyShift != false)))) ||
       (bVar28 = true, (pIVar37->IO).KeySuper == true)) {
      bVar28 = false;
      pIVar37->NavWindowingToggleLayer = false;
    }
    if ((((((pIVar37->IO).KeyMods & 4) == 0) && (((pIVar37->IO).KeyModsPrev & 4) != 0)) && (bVar28))
       && ((pIVar37->ActiveId == 0 || (pIVar37->ActiveIdAllowOverlap == true)))) {
      auVar52 = SUB6416(ZEXT464(0xc87a0000),0);
      uVar65 = vcmpps_avx512vl(auVar52,ZEXT416((uint)(pIVar37->IO).MousePos.x),2);
      auVar95 = (undefined1  [56])0x0;
      uVar94 = vcmpps_avx512vl(auVar52,ZEXT416((uint)(pIVar37->IO).MousePos.y),2);
      auVar107 = (undefined1  [56])0x0;
      uVar16 = vcmpps_avx512vl(auVar52,ZEXT416((uint)(pIVar37->IO).MousePosPrev.x),6);
      uVar17 = vcmpps_avx512vl(auVar52,ZEXT416((uint)(pIVar37->IO).MousePosPrev.y),6);
      bVar38 = ((byte)uVar16 | (byte)uVar17) ^ (byte)uVar65 & (byte)uVar94 | bVar38;
    }
    if ((pIVar37->IO).KeyAlt == false) {
      pIVar37->NavWindowingToggleLayer = false;
    }
  }
  pIVar43 = pIVar37->NavWindowingTarget;
  if ((pIVar43 != (ImGuiWindow *)0x0) && ((pIVar43->Flags & 4) == 0)) {
    if (pIVar37->NavInputSource == ImGuiInputSource_Gamepad) {
      dir_sources = 8;
LAB_00257d38:
      auVar87._0_8_ = GetNavInputAmount2d(dir_sources,ImGuiInputReadMode_Down,0.0,0.0);
      auVar87._8_56_ = extraout_var;
    }
    else {
      auVar87 = ZEXT1664(ZEXT816(0) << 0x40);
      if ((pIVar37->NavInputSource == ImGuiInputSource_Keyboard) &&
         ((pIVar37->IO).KeyShift == false)) {
        dir_sources = 1;
        goto LAB_00257d38;
      }
    }
    auVar107 = auVar87._8_56_;
    auVar95 = ZEXT856(0);
    if (auVar87._0_4_ == 0.0) {
      auVar52 = vmovshdup_avx(auVar87._0_16_);
      if ((auVar52._0_4_ == 0.0) && (!NAN(auVar52._0_4_))) goto LAB_00257dce;
    }
    pIVar43 = pIVar43->RootWindow;
    auVar52 = vminss_avx(ZEXT416((uint)(pIVar37->IO).DisplayFramebufferScale.x),
                         ZEXT416((uint)(pIVar37->IO).DisplayFramebufferScale.y));
    auVar52 = vcvtdq2ps_avx(ZEXT416((uint)(int)((pIVar37->IO).DeltaTime * 800.0 * auVar52._0_4_)));
    auVar97._0_4_ = auVar52._0_4_;
    auVar97._4_4_ = auVar97._0_4_;
    auVar97._8_4_ = auVar97._0_4_;
    auVar97._12_4_ = auVar97._0_4_;
    auVar95 = ZEXT856(auVar97._8_8_);
    auVar69._0_4_ = (pIVar43->Pos).x + auVar87._0_4_ * auVar97._0_4_;
    auVar69._4_4_ = (pIVar43->Pos).y + auVar87._4_4_ * auVar97._0_4_;
    auVar69._8_4_ = auVar87._8_4_ * auVar97._0_4_ + 0.0;
    auVar69._12_4_ = auVar87._12_4_ * auVar97._0_4_ + 0.0;
    auVar107 = ZEXT856(auVar69._8_8_);
    IVar6 = (ImVec2)vmovlps_avx(auVar69);
    local_78 = (undefined1  [8])IVar6;
    SetWindowPos(pIVar43,(ImVec2 *)local_78,1);
    MarkIniSettingsDirty(pIVar43);
    pIVar37->NavDisableMouseHover = true;
  }
LAB_00257dce:
  if (pIVar36 != (ImGuiWindow *)0x0) {
    if ((pIVar37->NavWindow == (ImGuiWindow *)0x0) || (pIVar36 != pIVar37->NavWindow->RootWindow)) {
      ClearActiveID();
      pIVar27 = GImGui;
      pIVar27->NavMousePosDirty = true;
      pIVar27->NavDisableHighlight = false;
      pIVar27->NavDisableMouseHover = true;
      pIVar43 = pIVar36->NavLastChildNavWindow;
      if ((pIVar43 == (ImGuiWindow *)0x0) || (pIVar43->WasActive == false)) {
        pIVar43 = pIVar36;
      }
      ClosePopupsOverWindow(pIVar43,false);
      FocusWindow(pIVar43);
      if (pIVar43->NavLastIds[0] == 0) {
        NavInitWindow(pIVar43,false);
      }
      if ((pIVar43->DC).NavLayersActiveMaskNext == 2) {
        pIVar37->NavLayer = ImGuiNavLayer_Menu;
      }
    }
    pIVar37->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if (((bVar38 & 1) != 0) && (pIVar37->NavWindow != (ImGuiWindow *)0x0)) {
    ClearActiveID();
    pIVar36 = pIVar37->NavWindow;
    pIVar43 = pIVar36;
    do {
      window = pIVar43;
      if ((window->ParentWindow == (ImGuiWindow *)0x0) ||
         (((window->DC).NavLayersActiveMask & 2) != 0)) break;
      pIVar43 = window->ParentWindow;
    } while ((window->Flags & 0x15000000U) == 0x1000000);
    if (window != pIVar36) {
      FocusWindow(window);
      window->NavLastChildNavWindow = pIVar36;
      pIVar36 = pIVar37->NavWindow;
    }
    IVar9 = pIVar37->NavLayer;
    if (((pIVar36->DC).NavLayersActiveMask & 2) == 0) {
      layer = ImGuiNavLayer_Main;
      if (IVar9 == ImGuiNavLayer_Main) goto LAB_00257f53;
    }
    else if (IVar9 == ImGuiNavLayer_Main) {
      pIVar36->NavLastIds[1] = 0;
      layer = ImGuiNavLayer_Menu;
    }
    else {
      layer = IVar9 ^ ImGuiNavLayer_Menu;
    }
    NavRestoreLayer(layer);
    pIVar37 = GImGui;
    pIVar37->NavMousePosDirty = true;
    pIVar37->NavDisableHighlight = false;
    pIVar37->NavDisableMouseHover = true;
  }
LAB_00257f53:
  if (((uVar30 & 1) == 0 && !bVar51) || (pIVar47->NavWindow == (ImGuiWindow *)0x0)) {
    (pIVar47->IO).NavActive = false;
LAB_00257fa0:
    bVar28 = pIVar47->NavWindowingTarget != (ImGuiWindow *)0x0;
  }
  else {
    bVar28 = (pIVar47->NavWindow->Flags & 0x40000U) == 0;
    (pIVar47->IO).NavActive = bVar28;
    if (((!bVar28) || (pIVar47->NavId == 0)) ||
       (bVar28 = true, pIVar47->NavDisableHighlight != false)) goto LAB_00257fa0;
  }
  (pIVar47->IO).NavVisible = bVar28;
  pIVar37 = GImGui;
  bVar28 = IsNavInputTest(1,ImGuiInputReadMode_Pressed);
  if (bVar28) {
    if (pIVar37->ActiveId == 0) {
      if (pIVar37->NavLayer == ImGuiNavLayer_Main) {
        pIVar36 = pIVar37->NavWindow;
        if (pIVar36 == (ImGuiWindow *)0x0) {
          uVar44 = (pIVar37->OpenPopupStack).Size;
          if (0 < (int)uVar44) {
LAB_0025852a:
            if ((((pIVar37->OpenPopupStack).Data[(ulong)uVar44 - 1].Window)->Flags & 0x8000000) == 0
               ) {
              ClosePopupToLevel(uVar44 - 1,true);
            }
            goto LAB_0025800d;
          }
        }
        else {
          if (((pIVar36 != pIVar36->RootWindow) && ((pIVar36->Flags & 0x4000000) == 0)) &&
             (pIVar43 = pIVar36->ParentWindow, pIVar43 != (ImGuiWindow *)0x0)) {
            IVar123 = ImGuiWindow::Rect(pIVar36);
            auVar103._0_8_ = IVar123.Max;
            auVar103._8_56_ = auVar95;
            auVar88._0_8_ = IVar123.Min;
            auVar88._8_56_ = auVar107;
            _local_78 = (ImRect)vmovlhps_avx(auVar88._0_16_,auVar103._0_16_);
            auVar107 = ZEXT856((ulong)local_78._8_8_);
            FocusWindow(pIVar43);
            IVar40 = pIVar36->ChildId;
            IVar123 = WindowRectAbsToRel(pIVar43,(ImRect *)local_78);
            pIVar37 = GImGui;
            auVar104._0_8_ = IVar123.Max;
            auVar104._8_56_ = auVar95;
            auVar89._0_8_ = IVar123.Min;
            auVar89._8_56_ = auVar107;
            IVar123 = (ImRect)vmovlhps_avx(auVar89._0_16_,auVar104._0_16_);
            GImGui->NavId = IVar40;
            pIVar37->NavLayer = ImGuiNavLayer_Main;
            pIVar37->NavFocusScopeId = 0;
            pIVar36 = pIVar37->NavWindow;
            pIVar36->NavLastIds[0] = IVar40;
            pIVar36->NavRectRel[0] = IVar123;
            goto LAB_00257ffd;
          }
          uVar44 = (pIVar37->OpenPopupStack).Size;
          if (0 < (int)uVar44) goto LAB_0025852a;
          if ((pIVar36->Flags & 0x5000000U) != 0x1000000) {
            pIVar36->NavLastIds[0] = 0;
          }
        }
        pIVar37->NavId = 0;
        pIVar37->NavFocusScopeId = 0;
      }
      else {
        NavRestoreLayer(ImGuiNavLayer_Main);
        pIVar37 = GImGui;
LAB_00257ffd:
        pIVar37->NavMousePosDirty = true;
        pIVar37->NavDisableHighlight = false;
        pIVar37->NavDisableMouseHover = true;
      }
    }
    else if ((GImGui->ActiveIdUsingNavInputMask & 2) == 0) {
      ClearActiveID();
    }
  }
LAB_0025800d:
  pIVar47->NavActivateFlags = 0;
  pIVar47->NavActivateId = 0;
  pIVar47->NavActivateDownId = 0;
  pIVar47->NavActivatePressedId = 0;
  pIVar47->NavActivateInputId = 0;
  if (((pIVar47->NavId == 0) || (pIVar47->NavDisableHighlight != false)) ||
     (pIVar47->NavWindowingTarget != (ImGuiWindow *)0x0)) {
LAB_00258044:
    if ((pIVar47->NavWindow != (ImGuiWindow *)0x0) && ((pIVar47->NavWindow->Flags & 0x40000) != 0))
    {
      pIVar47->NavDisableHighlight = true;
    }
  }
  else if (pIVar47->NavWindow != (ImGuiWindow *)0x0) {
    if ((pIVar47->NavWindow->Flags & 0x40000) != 0) goto LAB_00258044;
    fVar96 = (GImGui->IO).NavInputs[0];
    fVar62 = (GImGui->IO).NavInputs[2];
    if (0.0 < fVar96) {
      bVar28 = IsNavInputTest(0,ImGuiInputReadMode_Pressed);
    }
    else {
      bVar28 = false;
    }
    if (fVar62 <= 0.0) {
      bVar29 = false;
    }
    else {
      bVar29 = IsNavInputTest(2,ImGuiInputReadMode_Pressed);
    }
    IVar40 = pIVar47->ActiveId;
    if (bVar28 == true && IVar40 == 0) {
      pIVar47->NavActivateId = pIVar47->NavId;
      pIVar47->NavActivateFlags = 2;
LAB_00258629:
      if (bVar29 != false) {
        pIVar47->NavActivateInputId = pIVar47->NavId;
        pIVar47->NavActivateFlags = 1;
      }
      if (0.0 < fVar96) {
        pIVar47->NavActivateDownId = pIVar47->NavId;
      }
      if (bVar28 == false) goto LAB_00258044;
      IVar40 = pIVar47->NavId;
    }
    else {
      if (IVar40 == 0) goto LAB_00258629;
      IVar31 = pIVar47->NavId;
      if ((bVar29 & IVar40 == IVar31) != 0) {
        pIVar47->NavActivateInputId = IVar40;
        pIVar47->NavActivateFlags = 1;
      }
      if (IVar40 == IVar31 && 0.0 < fVar96) {
        pIVar47->NavActivateDownId = IVar40;
      }
      if ((bVar28 & IVar40 == IVar31) == 0) goto LAB_00258044;
    }
    pIVar47->NavActivatePressedId = IVar40;
    goto LAB_00258044;
  }
  IVar40 = pIVar47->NavNextActivateId;
  if (IVar40 != 0) {
    if ((pIVar47->NavNextActivateFlags & 1U) == 0) {
      pIVar47->NavActivatePressedId = IVar40;
      pIVar47->NavActivateDownId = IVar40;
      pIVar47->NavActivateId = IVar40;
    }
    else {
      pIVar47->NavActivateInputId = IVar40;
    }
    pIVar47->NavActivateFlags = pIVar47->NavNextActivateFlags;
  }
  pIVar47->NavNextActivateId = 0;
  pIVar37 = GImGui;
  pIVar36 = GImGui->NavWindow;
  if ((pIVar36 != (ImGuiWindow *)0x0 & GImGui->NavMoveForwardToNextFrame) == 1) {
    IVar34 = GImGui->NavMoveDir;
LAB_002581fa:
    pIVar27 = GImGui;
    fVar96 = 0.0;
    if ((IVar34 == -1) && (((pIVar37->IO).ConfigFlags & 1U) != 0)) {
      pIVar43 = GImGui->NavWindow;
      if (((pIVar43->Flags & 0x40000) == 0) && (GImGui->NavWindowingTarget == (ImGuiWindow *)0x0)) {
        lVar46 = (long)(GImGui->IO).KeyMap[5];
        uVar44 = 0;
        uVar48 = 0;
        if ((-1 < lVar46) && ((GImGui->IO).KeysDown[lVar46] == true)) {
          uVar44 = (uint)((GImGui->ActiveIdUsingKeyInputMask & 0x20) == 0);
        }
        lVar46 = (long)(GImGui->IO).KeyMap[6];
        if ((-1 < lVar46) && ((GImGui->IO).KeysDown[lVar46] == true)) {
          uVar48 = (ulong)((GImGui->ActiveIdUsingKeyInputMask & 0x40) == 0);
        }
        uVar41 = (uint)uVar48;
        bVar28 = IsKeyPressed((GImGui->IO).KeyMap[7],true);
        if (bVar28) {
          bVar28 = (pIVar27->ActiveIdUsingKeyInputMask & 0x80) == 0;
        }
        else {
          bVar28 = false;
        }
        bVar29 = IsKeyPressed((pIVar27->IO).KeyMap[8],true);
        if (bVar29) {
          uVar42 = (undefined4)
                   CONCAT71((int7)(uVar48 >> 8),(pIVar27->ActiveIdUsingKeyInputMask & 0x100) == 0);
        }
        else {
          uVar42 = 0;
        }
        if ((uVar44 != uVar41) || (bVar28 != SUB41(uVar42,0))) {
          local_5c = uVar42;
          if (pIVar27->NavLayer != ImGuiNavLayer_Main) {
            NavRestoreLayer(ImGuiNavLayer_Main);
          }
          if (((pIVar43->DC).NavLayersActiveMask == 0) && ((pIVar43->DC).NavHasScroll == true)) {
            bVar29 = IsKeyPressed((pIVar27->IO).KeyMap[5],true);
            if (bVar29) {
              fVar96 = (pIVar43->Scroll).y -
                       ((pIVar43->InnerRect).Max.y - (pIVar43->InnerRect).Min.y);
            }
            else {
              bVar29 = IsKeyPressed((pIVar27->IO).KeyMap[6],true);
              if (!bVar29) {
                if (bVar28 == false) {
                  if ((char)local_5c == '\0') goto LAB_002583e1;
                  (pIVar43->ScrollTarget).y = (pIVar43->ScrollMax).y;
                }
                else {
                  (pIVar43->ScrollTarget).y = 0.0;
                }
                (pIVar43->ScrollTargetCenterRatio).y = 0.0;
                (pIVar43->ScrollTargetEdgeSnapDist).y = 0.0;
                goto LAB_002583e1;
              }
              fVar96 = ((pIVar43->InnerRect).Max.y - (pIVar43->InnerRect).Min.y) +
                       (pIVar43->Scroll).y;
            }
            (pIVar43->ScrollTarget).y = fVar96;
            (pIVar43->ScrollTargetCenterRatio).y = 0.0;
            (pIVar43->ScrollTargetEdgeSnapDist).y = 0.0;
            goto LAB_002587ef;
          }
          fVar96 = (pIVar43->InnerRect).Max.y;
          IVar9 = pIVar27->NavLayer;
          fVar62 = (pIVar43->InnerRect).Min.y;
          fVar64 = ImGuiWindow::CalcFontSize(pIVar43);
          fVar96 = ((fVar96 - fVar62) - fVar64) +
                   (pIVar43->NavRectRel[IVar9].Max.y - pIVar43->NavRectRel[IVar9].Min.y);
          auVar70._0_12_ = ZEXT812(0);
          auVar70._12_4_ = 0;
          uVar65 = vcmpss_avx512f(ZEXT416((uint)fVar96),auVar70,2);
          auVar60._16_48_ = auVar61;
          auVar60._0_16_ = ZEXT416((uint)fVar96);
          auVar59._4_60_ = auVar60._4_60_;
          auVar59._0_4_ = (uint)!(bool)((byte)uVar65 & 1) * (int)fVar96;
          auVar52 = auVar59._0_16_;
          bVar29 = IsKeyPressed((pIVar27->IO).KeyMap[5],true);
          if (bVar29) {
            auVar20._8_4_ = 0x80000000;
            auVar20._0_8_ = 0x8000000080000000;
            auVar20._12_4_ = 0x80000000;
            auVar52 = vxorps_avx512vl(auVar52,auVar20);
            IVar34 = 2;
            IVar35 = 3;
          }
          else {
            bVar29 = IsKeyPressed((pIVar27->IO).KeyMap[6],true);
            if (!bVar29) {
              pIVar3 = pIVar43->NavRectRel + IVar9;
              if (bVar28 == false) {
                if ((char)local_5c != '\0') {
                  fVar96 = (pIVar43->ContentSize).y;
                  (pIVar3->Max).y = fVar96;
                  (pIVar3->Min).y = fVar96;
                  if ((pIVar3->Max).x < (pIVar3->Min).x) {
                    (pIVar3->Max).x = 0.0;
                    (pIVar3->Min).x = 0.0;
                  }
                  pIVar27->NavMoveDir = 2;
                  pIVar27->NavMoveFlags = 0x50;
                }
              }
              else {
                (pIVar3->Max).y = 0.0;
                (pIVar3->Min).y = 0.0;
                if ((pIVar3->Max).x < (pIVar3->Min).x) {
                  (pIVar3->Max).x = 0.0;
                  (pIVar3->Min).x = 0.0;
                }
                pIVar27->NavMoveDir = 3;
                pIVar27->NavMoveFlags = 0x50;
              }
              goto LAB_002583e1;
            }
            IVar35 = 2;
            IVar34 = 3;
          }
          pIVar27->NavMoveDir = IVar35;
          pIVar27->NavMoveClipDir = IVar34;
          pIVar27->NavMoveFlags = 0x30;
          fVar96 = auVar52._0_4_;
          if ((fVar96 != 0.0) || (NAN(fVar96))) {
            IVar6 = (pIVar36->InnerRect).Max;
            (pIVar37->NavScoringNoClipRect).Min = (pIVar36->InnerRect).Min;
            (pIVar37->NavScoringNoClipRect).Max = IVar6;
            (pIVar37->NavScoringNoClipRect).Min.y = fVar96 + (pIVar37->NavScoringNoClipRect).Min.y;
            (pIVar37->NavScoringNoClipRect).Max.y = fVar96 + (pIVar37->NavScoringNoClipRect).Max.y;
          }
          goto LAB_002587f3;
        }
      }
LAB_002583e1:
      fVar96 = 0.0;
    }
  }
  else {
    GImGui->NavMoveDir = -1;
    pIVar37->NavMoveFlags = 0;
    pIVar37->NavMoveScrollFlags = 0;
    if (((pIVar36 != (ImGuiWindow *)0x0) && (pIVar37->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
       ((pIVar36->Flags & 0x40000) == 0)) {
      if (((pIVar37->ActiveIdUsingNavDirMask & 1) == 0) &&
         ((bVar28 = IsNavInputTest(4,ImGuiInputReadMode_Repeat), bVar28 ||
          (bVar28 = IsNavInputTest(0x10,ImGuiInputReadMode_Repeat), bVar28)))) {
        pIVar37->NavMoveDir = 0;
      }
      if (((GImGui->ActiveIdUsingNavDirMask & 2) == 0) &&
         ((bVar28 = IsNavInputTest(5,ImGuiInputReadMode_Repeat), bVar28 ||
          (bVar28 = IsNavInputTest(0x11,ImGuiInputReadMode_Repeat), bVar28)))) {
        pIVar37->NavMoveDir = 1;
      }
      if (((GImGui->ActiveIdUsingNavDirMask & 4) == 0) &&
         ((bVar28 = IsNavInputTest(6,ImGuiInputReadMode_Repeat), bVar28 ||
          (bVar28 = IsNavInputTest(0x12,ImGuiInputReadMode_Repeat), bVar28)))) {
        pIVar37->NavMoveDir = 2;
      }
      if (((GImGui->ActiveIdUsingNavDirMask & 8) == 0) &&
         ((bVar28 = IsNavInputTest(7,ImGuiInputReadMode_Repeat), bVar28 ||
          (bVar28 = IsNavInputTest(0x13,ImGuiInputReadMode_Repeat), bVar28)))) {
        pIVar37->NavMoveDir = 3;
      }
    }
    IVar34 = pIVar37->NavMoveDir;
    pIVar37->NavMoveClipDir = IVar34;
    (pIVar37->NavScoringNoClipRect).Min.x = 3.4028235e+38;
    (pIVar37->NavScoringNoClipRect).Min.y = 3.4028235e+38;
    (pIVar37->NavScoringNoClipRect).Max.x = -3.4028235e+38;
    (pIVar37->NavScoringNoClipRect).Max.y = -3.4028235e+38;
    if (pIVar36 != (ImGuiWindow *)0x0) goto LAB_002581fa;
LAB_002587ef:
    fVar96 = 0.0;
  }
LAB_002587f3:
  pIVar37->NavMoveForwardToNextFrame = false;
  if (pIVar37->NavMoveDir != -1) {
    NavMoveRequestSubmit
              (pIVar37->NavMoveDir,pIVar37->NavMoveClipDir,pIVar37->NavMoveFlags,
               pIVar37->NavMoveScrollFlags);
  }
  if (pIVar37->NavMoveSubmitted == true) {
    if (pIVar37->NavId == 0) {
      pIVar37->NavInitRequest = true;
      pIVar37->NavInitRequestFromMove = true;
      pIVar37->NavInitResultId = 0;
      pIVar37->NavDisableHighlight = false;
    }
    if ((pIVar37->NavInputSource != ImGuiInputSource_Gamepad) ||
       (pIVar37->NavLayer != ImGuiNavLayer_Main || pIVar36 == (ImGuiWindow *)0x0))
    goto LAB_00258943;
    auVar71._8_4_ = 0xbf800000;
    auVar71._0_8_ = 0xbf800000bf800000;
    auVar71._12_4_ = 0xbf800000;
    auVar98._8_4_ = 0x3f800000;
    auVar98._0_8_ = 0x3f8000003f800000;
    auVar98._12_4_ = 0x3f800000;
    auVar107 = ZEXT856(auVar98._8_8_);
    auVar52 = vmovlhps_avx(auVar71,auVar98);
    local_48.Min.x = auVar52._0_4_ + (pIVar36->InnerRect).Min.x;
    local_48.Min.y = auVar52._4_4_ + (pIVar36->InnerRect).Min.y;
    local_48.Max.x = auVar52._8_4_ + (pIVar36->InnerRect).Max.x;
    local_48.Max.y = auVar52._12_4_ + (pIVar36->InnerRect).Max.y;
    auVar95 = ZEXT856((ulong)local_48.Max);
    IVar123 = WindowRectAbsToRel(pIVar36,&local_48);
    auVar105._0_8_ = IVar123.Max;
    auVar105._8_56_ = auVar107;
    auVar90._0_8_ = IVar123.Min;
    auVar90._8_56_ = auVar95;
    _local_78 = (ImRect)vmovlhps_avx(auVar90._0_16_,auVar105._0_16_);
    bVar28 = ImRect::Contains((ImRect *)local_78,pIVar36->NavRectRel + pIVar37->NavLayer);
    if (!bVar28) {
      fVar62 = ImGuiWindow::CalcFontSize(pIVar36);
      IVar123 = _local_78;
      fVar62 = fVar62 * 0.5;
      auVar109._8_4_ = IStack_70.x;
      auVar109._12_4_ = IStack_70.y;
      auVar109._0_4_ = IStack_70.x;
      auVar109._4_4_ = IStack_70.y;
      auVar52 = vsubps_avx(auVar109,(undefined1  [16])IVar123);
      auVar72._4_4_ = fVar62;
      auVar72._0_4_ = fVar62;
      auVar72._8_4_ = fVar62;
      auVar72._12_4_ = fVar62;
      auVar52 = vminps_avx(auVar52,auVar72);
      auVar110._8_8_ = auVar52._0_8_;
      auVar110._0_8_ = auVar52._0_8_;
      local_78._4_4_ = IVar123.Min.y + auVar52._4_4_;
      local_78._0_4_ = IVar123.Min.x + auVar52._0_4_;
      auVar52 = vsubps_avx((undefined1  [16])IVar123,auVar110);
      IStack_70 = auVar52._8_8_;
      ImRect::ClipWithFull(pIVar36->NavRectRel + pIVar37->NavLayer,(ImRect *)local_78);
      pIVar37->NavId = 0;
      pIVar37->NavFocusScopeId = 0;
    }
LAB_00258956:
    IVar9 = pIVar37->NavLayer;
    auVar73._8_8_ = 0;
    auVar73._0_4_ = pIVar36->NavRectRel[IVar9].Min.x;
    auVar73._4_4_ = pIVar36->NavRectRel[IVar9].Min.y;
    auVar99._8_8_ = 0;
    auVar99._0_4_ = pIVar36->NavRectRel[IVar9].Max.x;
    auVar99._4_4_ = pIVar36->NavRectRel[IVar9].Max.y;
    auVar95 = ZEXT856(0);
    uVar48 = vcmpps_avx512vl(auVar99,auVar73,1);
    if ((uVar48 & 3) == 0) {
      local_48 = pIVar36->NavRectRel[IVar9];
    }
    else {
      local_48 = (ImRect)(ZEXT816(0) << 0x20);
    }
    auVar107 = ZEXT856((ulong)local_48.Max);
    IVar123 = WindowRectRelToAbs(pIVar36,&local_48);
    auVar106._0_8_ = IVar123.Max;
    auVar106._8_56_ = auVar95;
    auVar91._0_8_ = IVar123.Min;
    auVar91._8_56_ = auVar107;
    auVar66 = vmovshdup_avx(auVar91._0_16_);
    auVar52 = vminss_avx(ZEXT416((uint)(IVar123.Min.x + 1.0)),auVar106._0_16_);
    auVar25._4_4_ = IStack_70.x;
    auVar25._8_4_ = IStack_70.y;
    auVar25._0_4_ = fVar96 + auVar66._0_4_;
    _local_78 = auVar25 << 0x20;
    auVar66 = vmovshdup_avx(auVar106._0_16_);
    fVar96 = fVar96 + auVar66._0_4_;
    IStack_70.y = fVar96;
    local_78._0_4_ = auVar52._0_4_;
    IStack_70.x = auVar52._0_4_;
  }
  else {
LAB_00258943:
    _local_78 = (ImRect)ZEXT816(0);
    if (pIVar36 != (ImGuiWindow *)0x0) goto LAB_00258956;
  }
  IVar123 = _local_78;
  (pIVar37->NavScoringRect).Min.x = (float)local_78._0_4_;
  (pIVar37->NavScoringRect).Min.y = (float)local_78._4_4_;
  (pIVar37->NavScoringRect).Max = IStack_70;
  _local_78 = IVar123;
  ImRect::Add(&pIVar37->NavScoringNoClipRect,(ImRect *)local_78);
  pIVar37 = GImGui;
  if ((((((pIVar47->NavMoveDir == -1) &&
         (pIVar36 = GImGui->NavWindow, pIVar36 != (ImGuiWindow *)0x0)) &&
        (GImGui->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
       (((pIVar36->Flags & 0x40000) == 0 && (bVar28 = IsKeyPressedMap(0,true), bVar28)))) &&
      ((GImGui->ActiveIdUsingKeyInputMask & 1) == 0)) &&
     (((pIVar37->IO).KeyCtrl == false && ((pIVar37->IO).KeyAlt == false)))) {
    if ((pIVar37->IO).KeyShift == false) {
      uVar44 = (uint)(pIVar37->ActiveId != 0);
    }
    else {
      uVar44 = 0xffffffff;
    }
    pIVar37->NavTabbingDir = uVar44;
    scroll_flags = 3;
    if (pIVar36->Appearing != false) {
      scroll_flags = 0x21;
    }
    NavMoveRequestSubmit(-1,uVar44 >> 0x1f ^ 3,0x400,scroll_flags);
    auVar101._8_4_ = 0x7f7fffff;
    auVar101._0_8_ = 0x7f7fffff7f7fffff;
    auVar101._12_4_ = 0x7f7fffff;
    (pIVar37->NavTabbingResultFirst).InFlags = 0;
    (pIVar37->NavTabbingResultFirst).Window = (ImGuiWindow *)0x0;
    (pIVar37->NavTabbingResultFirst).ID = 0;
    (pIVar37->NavTabbingResultFirst).FocusScopeId = 0;
    (pIVar37->NavTabbingResultFirst).DistAxial = 3.4028235e+38;
    uVar65 = vmovlps_avx(auVar101);
    (pIVar37->NavTabbingResultFirst).DistBox = (float)(int)uVar65;
    (pIVar37->NavTabbingResultFirst).DistCenter = (float)(int)((ulong)uVar65 >> 0x20);
    pIVar37->NavTabbingCounter = -1;
  }
  bVar28 = true;
  if (GImGui->NavMoveScoringItems == false) {
    bVar28 = GImGui->NavInitRequest;
  }
  GImGui->NavAnyRequest = bVar28;
  pIVar47->NavIdIsAlive = false;
  pIVar36 = pIVar47->NavWindow;
  if (((pIVar36 != (ImGuiWindow *)0x0) && ((pIVar36->Flags & 0x40000) == 0)) &&
     (pIVar47->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar96 = ImGuiWindow::CalcFontSize(pIVar36);
    auVar52 = vfmadd213ss_fma(ZEXT416((uint)(pIVar47->IO).DeltaTime),ZEXT416((uint)(fVar96 * 100.0))
                              ,ZEXT416(0x3f000000));
    auVar74._0_4_ = (int)auVar52._0_4_;
    auVar74._4_4_ = (int)auVar52._4_4_;
    auVar74._8_4_ = (int)auVar52._8_4_;
    auVar74._12_4_ = (int)auVar52._12_4_;
    auVar52 = vcvtdq2ps_avx(auVar74);
    if (((pIVar36->DC).NavLayersActiveMask == 0) &&
       (uVar44 = pIVar47->NavMoveDir, (uVar44 != 0xffffffff & (pIVar36->DC).NavHasScroll) == 1)) {
      if (uVar44 < 2) {
        auVar66 = vfmadd213ss_fma(ZEXT416(*(uint *)((long)&DAT_002c1d40 + (ulong)(uVar44 == 0) * 4))
                                  ,auVar52,ZEXT416((uint)(pIVar36->Scroll).x));
        auVar75._0_4_ = (int)auVar66._0_4_;
        auVar75._4_4_ = (int)auVar66._4_4_;
        auVar75._8_4_ = (int)auVar66._8_4_;
        auVar75._12_4_ = (int)auVar66._12_4_;
        auVar66 = vcvtdq2ps_avx(auVar75);
        (pIVar36->ScrollTarget).x = auVar66._0_4_;
        (pIVar36->ScrollTargetCenterRatio).x = 0.0;
        (pIVar36->ScrollTargetEdgeSnapDist).x = 0.0;
      }
      if ((uVar44 & 0xfffffffe) == 2) {
        auVar66 = vfmadd213ss_fma(ZEXT416(*(uint *)((long)&DAT_002c1d40 + (ulong)(uVar44 == 2) * 4))
                                  ,auVar52,ZEXT416((uint)(pIVar36->Scroll).y));
        auVar76._0_4_ = (int)auVar66._0_4_;
        auVar76._4_4_ = (int)auVar66._4_4_;
        auVar76._8_4_ = (int)auVar66._8_4_;
        auVar76._12_4_ = (int)auVar66._12_4_;
        auVar66 = vcvtdq2ps_avx(auVar76);
        (pIVar36->ScrollTarget).y = auVar66._0_4_;
        (pIVar36->ScrollTargetCenterRatio).y = 0.0;
        (pIVar36->ScrollTargetEdgeSnapDist).y = 0.0;
      }
    }
    auVar92._0_8_ = GetNavInputAmount2d(8,ImGuiInputReadMode_Down,0.1,10.0);
    auVar92._8_56_ = extraout_var_00;
    if (((auVar92._0_4_ != 0.0) || (NAN(auVar92._0_4_))) && (pIVar36->ScrollbarX == true)) {
      auVar66 = vfmadd231ss_fma(ZEXT416((uint)(pIVar36->Scroll).x),auVar92._0_16_,auVar52);
      auVar111._0_4_ = (int)auVar66._0_4_;
      auVar111._4_4_ = (int)auVar66._4_4_;
      auVar111._8_4_ = (int)auVar66._8_4_;
      auVar111._12_4_ = (int)auVar66._12_4_;
      auVar66 = vcvtdq2ps_avx(auVar111);
      (pIVar36->ScrollTarget).x = auVar66._0_4_;
      (pIVar36->ScrollTargetCenterRatio).x = 0.0;
      (pIVar36->ScrollTargetEdgeSnapDist).x = 0.0;
    }
    auVar66 = vmovshdup_avx(auVar92._0_16_);
    if ((auVar66._0_4_ != 0.0) || (NAN(auVar66._0_4_))) {
      auVar52 = vfmadd213ss_fma(auVar52,auVar66,ZEXT416((uint)(pIVar36->Scroll).y));
      auVar77._0_4_ = (int)auVar52._0_4_;
      auVar77._4_4_ = (int)auVar52._4_4_;
      auVar77._8_4_ = (int)auVar52._8_4_;
      auVar77._12_4_ = (int)auVar52._12_4_;
      auVar52 = vcvtdq2ps_avx(auVar77);
      (pIVar36->ScrollTarget).y = auVar52._0_4_;
      (pIVar36->ScrollTargetCenterRatio).y = 0.0;
      (pIVar36->ScrollTargetEdgeSnapDist).y = 0.0;
    }
  }
  if ((uVar30 & 1) == 0 && !bVar51) {
    pIVar47->NavDisableHighlight = true;
    pIVar47->NavDisableMouseHover = false;
  }
  else if (((bVar50) && (((pIVar47->IO).ConfigFlags & 4) != 0)) &&
          (((pIVar47->IO).BackendFlags & 4) != 0)) {
    auVar93._0_8_ = NavCalcPreferredRefPos();
    auVar93._8_56_ = extraout_var_01;
    IVar6 = (ImVec2)vmovlps_avx(auVar93._0_16_);
    (pIVar47->IO).MousePosPrev = IVar6;
    IVar6 = (ImVec2)vmovlps_avx(auVar93._0_16_);
    (pIVar47->IO).MousePos = IVar6;
    (pIVar47->IO).WantSetMousePos = true;
  }
  pIVar47->NavScoringDebugCount = 0;
  pIVar47 = GImGui;
  IVar6 = (GImGui->IO).MousePos;
  auVar78._8_8_ = 0;
  auVar78._0_4_ = IVar6.x;
  auVar78._4_4_ = IVar6.y;
  if ((-256000.0 <= IVar6.x) && (auVar52 = vmovshdup_avx(auVar78), -256000.0 <= auVar52._0_4_)) {
    auVar79._0_4_ = (int)IVar6.x;
    auVar79._4_4_ = (int)IVar6.y;
    auVar79._8_8_ = 0;
    auVar78 = vcvtdq2ps_avx(auVar79);
    IVar6 = (ImVec2)vmovlps_avx(auVar78);
    GImGui->MouseLastValidPos = IVar6;
    IVar6 = (ImVec2)vmovlps_avx(auVar78);
    (pIVar47->IO).MousePos = IVar6;
  }
  auVar52 = vmovshdup_avx(auVar78);
  if (((auVar78._0_4_ < -256000.0) || (auVar52._0_4_ < -256000.0)) ||
     ((IVar6 = (pIVar47->IO).MousePosPrev, auVar112._8_8_ = 0, auVar112._0_4_ = IVar6.x,
      auVar112._4_4_ = IVar6.y, IVar6.x < -256000.0 ||
      (auVar66 = vmovshdup_avx(auVar112), auVar66._0_4_ < -256000.0)))) {
    (pIVar47->IO).MouseDelta.x = 0.0;
    (pIVar47->IO).MouseDelta.y = 0.0;
  }
  else {
    auVar66 = vsubps_avx(auVar78,auVar112);
    IVar6 = (ImVec2)vmovlps_avx(auVar66);
    (pIVar47->IO).MouseDelta = IVar6;
    if ((auVar66._0_4_ == 0.0) && (!NAN(auVar66._0_4_))) {
      auVar66 = vmovshdup_avx(auVar66);
      if ((auVar66._0_4_ == 0.0) && (!NAN(auVar66._0_4_))) goto LAB_00258caa;
    }
    pIVar47->NavDisableMouseHover = false;
  }
LAB_00258caa:
  IVar6 = (pIVar47->IO).MousePos;
  lVar46 = 0;
  (pIVar47->IO).MousePosPrev = IVar6;
  auVar80._4_12_ = auVar78._4_12_;
  auVar80._0_4_ = IVar6.x;
  uVar48 = vcmpps_avx512vl(SUB6416(ZEXT464(0xc87a0000),0),ZEXT416((uint)IVar6.x),2);
  uVar18 = vcmpps_avx512vl(SUB6416(ZEXT464(0xc87a0000),0),auVar52,2);
  for (; lVar46 != 5; lVar46 = lVar46 + 1) {
    if ((pIVar47->IO).MouseDown[lVar46] == true) {
      fVar96 = (pIVar47->IO).MouseDownDuration[lVar46];
      pbVar45 = (pIVar47->IO).MouseClicked + lVar46;
      *pbVar45 = fVar96 < 0.0;
      (pIVar47->IO).MouseClickedCount[lVar46] = 0;
      pbVar45[0x1e] = false;
      (pIVar47->IO).MouseDownDurationPrev[lVar46] = fVar96;
      if (0.0 <= fVar96) {
        (pIVar47->IO).MouseDownDuration[lVar46] = fVar96 + (pIVar47->IO).DeltaTime;
        auVar114._0_12_ = ZEXT812(0);
        auVar114._12_4_ = 0;
        if ((uVar48 & uVar18 & 1) != 0) {
          pIVar4 = (pIVar47->IO).MouseClickedPos + lVar46;
          auVar115._8_8_ = 0;
          auVar115._0_4_ = pIVar4->x;
          auVar115._4_4_ = pIVar4->y;
          auVar114 = vsubps_avx(auVar80,auVar115);
        }
        auVar121._0_4_ = auVar114._0_4_ * auVar114._0_4_;
        auVar121._4_4_ = auVar114._4_4_ * auVar114._4_4_;
        fVar62 = auVar114._8_4_;
        auVar121._8_4_ = fVar62 * fVar62;
        fVar64 = auVar114._12_4_;
        auVar121._12_4_ = fVar64 * fVar64;
        fVar96 = (pIVar47->IO).MouseDragMaxDistanceSqr[lVar46];
        auVar52 = vmovshdup_avx(auVar121);
        auVar52 = vfmadd231ss_fma(auVar52,auVar114,auVar114);
        uVar65 = vcmpss_avx512f(auVar52,ZEXT416((uint)fVar96),2);
        bVar51 = (bool)((byte)uVar65 & 1);
        (pIVar47->IO).MouseDragMaxDistanceSqr[lVar46] =
             (float)((uint)bVar51 * (int)fVar96 + (uint)!bVar51 * auVar52._0_4_);
        auVar122._0_8_ = auVar114._0_8_ ^ 0x8000000080000000;
        auVar122._8_4_ = -fVar62;
        auVar122._12_4_ = -fVar64;
        IVar8 = (pIVar47->IO).MouseDragMaxDistanceAbs[lVar46];
        auVar118._8_8_ = 0;
        auVar118._0_4_ = IVar8.x;
        auVar118._4_4_ = IVar8.y;
        auVar52 = vmaxps_avx(auVar122,auVar114);
        uVar19 = vcmpps_avx512vl(auVar52,auVar118,2);
        bVar51 = (bool)((byte)uVar19 & 1);
        auVar54._0_4_ = (uint)bVar51 * (int)IVar8.x | (uint)!bVar51 * auVar52._0_4_;
        bVar51 = (bool)((byte)(uVar19 >> 1) & 1);
        auVar54._4_4_ = (uint)bVar51 * (int)IVar8.y | (uint)!bVar51 * auVar52._4_4_;
        auVar54._8_4_ = (uint)!(bool)((byte)(uVar19 >> 2) & 1) * auVar52._8_4_;
        auVar54._12_4_ = (uint)!(bool)((byte)(uVar19 >> 3) & 1) * auVar52._12_4_;
        IVar8 = (ImVec2)vmovlps_avx(auVar54);
        (pIVar47->IO).MouseDragMaxDistanceAbs[lVar46] = IVar8;
        goto LAB_00258e6a;
      }
      (pIVar47->IO).MouseDownDuration[lVar46] = 0.0;
      dVar7 = pIVar47->Time;
      if ((pIVar47->IO).MouseDoubleClickTime <=
          (float)(dVar7 - (pIVar47->IO).MouseClickedTime[lVar46])) {
LAB_00258e6f:
        (pIVar47->IO).MouseClickedLastCount[lVar46] = 1;
      }
      else {
        auVar52 = ZEXT416(0) << 0x20;
        if ((uVar48 & uVar18 & 1) != 0) {
          pIVar4 = (pIVar47->IO).MouseClickedPos + lVar46;
          auVar117._8_8_ = 0;
          auVar117._0_4_ = pIVar4->x;
          auVar117._4_4_ = pIVar4->y;
          auVar52 = vsubps_avx(auVar80,auVar117);
        }
        auVar120._0_4_ = auVar52._0_4_ * auVar52._0_4_;
        auVar120._4_4_ = auVar52._4_4_ * auVar52._4_4_;
        auVar120._8_4_ = auVar52._8_4_ * auVar52._8_4_;
        auVar120._12_4_ = auVar52._12_4_ * auVar52._12_4_;
        auVar66 = vmovshdup_avx(auVar120);
        auVar52 = vfmadd231ss_fma(auVar66,auVar52,auVar52);
        fVar96 = (pIVar47->IO).MouseDoubleClickMaxDist;
        if (fVar96 * fVar96 <= auVar52._0_4_) goto LAB_00258e6f;
        pIVar5 = (pIVar47->IO).MouseClickedLastCount + lVar46;
        *pIVar5 = *pIVar5 + 1;
      }
      (pIVar47->IO).MouseClickedTime[lVar46] = dVar7;
      (pIVar47->IO).MouseClickedPos[lVar46] = IVar6;
      (pIVar47->IO).MouseClickedCount[lVar46] = (pIVar47->IO).MouseClickedLastCount[lVar46];
      pIVar4 = (pIVar47->IO).MouseDragMaxDistanceAbs + lVar46;
      pIVar4->x = 0.0;
      pIVar4->y = 0.0;
      (pIVar47->IO).MouseDragMaxDistanceSqr[lVar46] = 0.0;
      bVar51 = (pIVar47->IO).MouseClickedCount[lVar46] == 2;
    }
    else {
      (pIVar47->IO).MouseClicked[lVar46] = false;
      (pIVar47->IO).MouseClickedCount[lVar46] = 0;
      pbVar45 = (pIVar47->IO).MouseClicked + lVar46;
      fVar96 = (pIVar47->IO).MouseDownDuration[lVar46];
      (pIVar47->IO).MouseReleased[lVar46] = 0.0 <= fVar96;
      (pIVar47->IO).MouseDownDurationPrev[lVar46] = fVar96;
      (pIVar47->IO).MouseDownDuration[lVar46] = -1.0;
LAB_00258e6a:
      bVar51 = false;
    }
    (pIVar47->IO).MouseDoubleClicked[lVar46] = bVar51;
    if (*pbVar45 == true) {
      pIVar47->NavDisableMouseHover = false;
    }
  }
  UpdateHoveredWindowAndCaptureFlags();
  UpdateMouseMovingWindowNewFrame();
  pIVar36 = GetTopMostPopupModal();
  if ((pIVar36 != (ImGuiWindow *)0x0) ||
     ((ctx->NavWindowingTarget != (ImGuiWindow *)0x0 && (0.0 < ctx->NavWindowingHighlightAlpha)))) {
    auVar52 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40c00000),0),ZEXT416((uint)(ctx->IO).DeltaTime),
                              ZEXT416((uint)ctx->DimBgRatio));
    auVar52 = vminss_avx(auVar52,ZEXT416(0x3f800000));
    fVar96 = auVar52._0_4_;
  }
  else {
    auVar52 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1200000),0),ZEXT416((uint)(ctx->IO).DeltaTime),
                              ZEXT416((uint)ctx->DimBgRatio));
    uVar65 = vcmpss_avx512f(ZEXT816(0),auVar52,2);
    fVar96 = (float)((uint)((byte)uVar65 & 1) * auVar52._0_4_);
  }
  ctx->DimBgRatio = fVar96;
  ctx->MouseCursor = 0;
  ctx->WantTextInputNextFrame = -1;
  ctx->WantCaptureMouseNextFrame = -1;
  ctx->WantCaptureKeyboardNextFrame = -1;
  (ctx->PlatformImePos).x = 1.0;
  pIVar47 = GImGui;
  (ctx->PlatformImePos).y = 1.0;
  pIVar36 = GImGui->WheelingWindow;
  if (pIVar36 == (ImGuiWindow *)0x0) {
LAB_0025909d:
    pIVar36 = (ImGuiWindow *)0x0;
  }
  else {
    fVar62 = GImGui->WheelingWindowTimer - (GImGui->IO).DeltaTime;
    GImGui->WheelingWindowTimer = fVar62;
    fVar96 = (pIVar47->IO).MousePos.x;
    if ((((-256000.0 <= fVar96) && (fVar64 = (pIVar47->IO).MousePos.y, -256000.0 <= fVar64)) &&
        (fVar64 = fVar64 - (pIVar47->WheelingWindowRefMousePos).y,
        auVar52 = ZEXT416((uint)(fVar96 - (pIVar47->WheelingWindowRefMousePos).x)),
        auVar52 = vfmadd231ss_fma(ZEXT416((uint)(fVar64 * fVar64)),auVar52,auVar52),
        fVar96 = (pIVar47->IO).MouseDragThreshold, fVar96 * fVar96 < auVar52._0_4_)) ||
       (fVar62 <= 0.0)) {
      pIVar47->WheelingWindow = (ImGuiWindow *)0x0;
      pIVar47->WheelingWindowTimer = 0.0;
      goto LAB_0025909d;
    }
  }
  fVar96 = (pIVar47->IO).MouseWheel;
  if (((((fVar96 != 0.0) || (fVar62 = (pIVar47->IO).MouseWheelH, fVar62 != 0.0)) || (NAN(fVar62)))
      && ((pIVar47->ActiveId == 0 || (pIVar47->ActiveIdUsingMouseWheel == false)))) &&
     (((pIVar47->HoveredIdPreviousFrame == 0 ||
       (pIVar47->HoveredIdPreviousFrameUsingMouseWheel == false)) &&
      (((pIVar36 != (ImGuiWindow *)0x0 ||
        (pIVar36 = pIVar47->HoveredWindow, pIVar36 != (ImGuiWindow *)0x0)) &&
       (pIVar36->Collapsed == false)))))) {
    bVar51 = (pIVar47->IO).KeyCtrl;
    if ((fVar96 != 0.0) || (NAN(fVar96))) {
      if ((bVar51 & 1U) != 0) {
        if ((pIVar47->IO).FontAllowUserScaling == true) {
          StartLockWheelingWindow(pIVar36);
          fVar96 = pIVar36->FontWindowScale;
          auVar66 = vfmadd132ss_fma(ZEXT416((uint)(pIVar47->IO).MouseWheel),ZEXT416((uint)fVar96),
                                    ZEXT416(0x3dcccccd));
          auVar52 = vminss_avx(SUB6416(ZEXT464(0x40200000),0),auVar66);
          uVar65 = vcmpss_avx512f(auVar66,SUB6416(ZEXT464(0x3f000000),0),1);
          bVar51 = (bool)((byte)uVar65 & 1);
          fVar62 = (float)((uint)bVar51 * 0x3f000000 + (uint)!bVar51 * auVar52._0_4_);
          pIVar36->FontWindowScale = fVar62;
          if (pIVar36 == pIVar36->RootWindow) {
            fVar62 = fVar62 / fVar96;
            IVar6 = pIVar36->Pos;
            auVar119._8_8_ = 0;
            auVar119._0_4_ = IVar6.x;
            auVar119._4_4_ = IVar6.y;
            auVar116._8_8_ = 0;
            auVar116._0_4_ = (pIVar47->IO).MousePos.x;
            auVar116._4_4_ = (pIVar47->IO).MousePos.y;
            IVar8 = pIVar36->Size;
            auVar113._8_8_ = 0;
            auVar113._0_4_ = IVar8.x;
            auVar113._4_4_ = IVar8.y;
            auVar52 = vsubps_avx(auVar116,auVar119);
            fVar96 = 1.0 - fVar62;
            auVar81._0_4_ = fVar96 * IVar8.x * auVar52._0_4_;
            auVar81._4_4_ = fVar96 * IVar8.y * auVar52._4_4_;
            auVar81._8_4_ = fVar96 * 0.0 * auVar52._8_4_;
            auVar81._12_4_ = fVar96 * 0.0 * auVar52._12_4_;
            auVar52 = vdivps_avx(auVar81,auVar113);
            auVar82._0_4_ = IVar6.x + auVar52._0_4_;
            auVar82._4_4_ = IVar6.y + auVar52._4_4_;
            auVar82._8_4_ = auVar52._8_4_ + 0.0;
            auVar82._12_4_ = auVar52._12_4_ + 0.0;
            IVar6 = (ImVec2)vmovlps_avx(auVar82);
            local_78 = (undefined1  [8])IVar6;
            SetWindowPos(pIVar36,(ImVec2 *)local_78,0);
            auVar100._0_4_ = (int)(fVar62 * (pIVar36->Size).x);
            auVar100._4_4_ = (int)(fVar62 * (pIVar36->Size).y);
            auVar100._8_4_ = (int)(fVar62 * 0.0);
            auVar100._12_4_ = (int)(fVar62 * 0.0);
            auVar83._0_4_ = (int)(fVar62 * (pIVar36->SizeFull).x);
            auVar83._4_4_ = (int)(fVar62 * (pIVar36->SizeFull).y);
            auVar83._8_4_ = (int)(fVar62 * 0.0);
            auVar83._12_4_ = (int)(fVar62 * 0.0);
            auVar52 = vcvtdq2ps_avx(auVar100);
            auVar66 = vcvtdq2ps_avx(auVar83);
            auVar52 = vmovlhps_avx(auVar52,auVar66);
            (pIVar36->Size).x = (float)(int)auVar52._0_8_;
            (pIVar36->Size).y = (float)(int)((ulong)auVar52._0_8_ >> 0x20);
            (pIVar36->SizeFull).x = (float)(int)auVar52._8_8_;
            (pIVar36->SizeFull).y = (float)(int)((ulong)auVar52._8_8_ >> 0x20);
          }
        }
        goto LAB_0025910d;
      }
    }
    else if ((bVar51 & 1U) != 0) goto LAB_0025910d;
    if (((pIVar47->IO).KeyShift != true) ||
       (local_88 = fVar96, (pIVar47->IO).ConfigMacOSXBehaviors == true)) {
      local_88 = (pIVar47->IO).MouseWheelH;
      if ((fVar96 != 0.0) || (NAN(fVar96))) {
        StartLockWheelingWindow(pIVar36);
        while ((uVar30 = pIVar36->Flags, (uVar30 >> 0x18 & 1) != 0 &&
               (((uVar30 & 0x210) == 0x10 ||
                ((fVar62 = (pIVar36->ScrollMax).y, fVar62 == 0.0 && (!NAN(fVar62)))))))) {
          pIVar36 = pIVar36->ParentWindow;
        }
        if ((uVar30 & 0x210) == 0) {
          fVar62 = (pIVar36->InnerRect).Max.y;
          fVar64 = (pIVar36->InnerRect).Min.y;
          fVar63 = ImGuiWindow::CalcFontSize(pIVar36);
          auVar52 = vminss_avx(ZEXT416((uint)(fVar63 * 5.0)),
                               ZEXT416((uint)((fVar62 - fVar64) * 0.67)));
          auVar84._0_4_ = (int)auVar52._0_4_;
          auVar84._4_4_ = (int)auVar52._4_4_;
          auVar84._8_4_ = (int)auVar52._8_4_;
          auVar84._12_4_ = (int)auVar52._12_4_;
          auVar52 = vcvtdq2ps_avx(auVar84);
          auVar52 = vfnmadd213ss_fma(auVar52,ZEXT416((uint)fVar96),
                                     ZEXT416((uint)(pIVar36->Scroll).y));
          (pIVar36->ScrollTarget).y = auVar52._0_4_;
          (pIVar36->ScrollTargetCenterRatio).y = 0.0;
          (pIVar36->ScrollTargetEdgeSnapDist).y = 0.0;
        }
      }
    }
    if ((local_88 != 0.0) || (NAN(local_88))) {
      StartLockWheelingWindow(pIVar36);
      while ((uVar30 = pIVar36->Flags, (uVar30 >> 0x18 & 1) != 0 &&
             (((uVar30 & 0x210) == 0x10 ||
              ((fVar96 = (pIVar36->ScrollMax).x, fVar96 == 0.0 && (!NAN(fVar96)))))))) {
        pIVar36 = pIVar36->ParentWindow;
      }
      if ((uVar30 & 0x210) == 0) {
        fVar96 = (pIVar36->InnerRect).Max.x;
        fVar62 = (pIVar36->InnerRect).Min.x;
        fVar64 = ImGuiWindow::CalcFontSize(pIVar36);
        auVar52 = vminss_avx(ZEXT416((uint)(fVar64 + fVar64)),
                             ZEXT416((uint)((fVar96 - fVar62) * 0.67)));
        auVar85._0_4_ = (int)auVar52._0_4_;
        auVar85._4_4_ = (int)auVar52._4_4_;
        auVar85._8_4_ = (int)auVar52._8_4_;
        auVar85._12_4_ = (int)auVar52._12_4_;
        auVar52 = vcvtdq2ps_avx(auVar85);
        auVar52 = vfnmadd213ss_fma(auVar52,ZEXT416((uint)local_88),
                                   ZEXT416((uint)(pIVar36->Scroll).x));
        (pIVar36->ScrollTarget).x = auVar52._0_4_;
        (pIVar36->ScrollTargetCenterRatio).x = 0.0;
        (pIVar36->ScrollTargetEdgeSnapDist).x = 0.0;
      }
    }
  }
LAB_0025910d:
  if ((ctx->GcCompactAll == false) && (fVar96 = (ctx->IO).ConfigMemoryCompactTimer, 0.0 <= fVar96))
  {
    local_58 = ZEXT416((uint)((float)ctx->Time - fVar96));
  }
  for (uVar48 = 0; uVar48 != (uint)(ctx->Windows).Size; uVar48 = uVar48 + 1) {
    pIVar36 = (ctx->Windows).Data[uVar48];
    bVar51 = pIVar36->Active;
    pIVar36->WasActive = bVar51;
    pIVar36->BeginCount = 0;
    pIVar36->Active = false;
    pIVar36->WriteAccessed = false;
    if (((bVar51 == false) && (pIVar36->MemoryCompacted == false)) &&
       (pIVar36->LastTimeActive < local_58._0_4_)) {
      GcCompactTransientWindowBuffers(pIVar36);
    }
  }
  lVar46 = 0;
  for (lVar49 = 0; lVar49 < (ctx->TablesLastTimeActive).Size; lVar49 = lVar49 + 1) {
    fVar96 = (ctx->TablesLastTimeActive).Data[lVar49];
    if ((0.0 <= fVar96) && (fVar96 < local_58._0_4_)) {
      TableGcCompactTransientBuffers((ImGuiTable *)((long)&((ctx->Tables).Buf.Data)->ID + lVar46));
    }
    lVar46 = lVar46 + 0x208;
  }
  lVar46 = 0;
  for (lVar49 = 0; lVar49 < (ctx->TablesTempData).Size; lVar49 = lVar49 + 1) {
    pIVar13 = (ctx->TablesTempData).Data;
    fVar96 = *(float *)((long)&pIVar13->LastTimeActive + lVar46);
    if ((0.0 <= fVar96) && (fVar96 < local_58._0_4_)) {
      TableGcCompactTransientBuffers((ImGuiTableTempData *)((long)&pIVar13->TableIndex + lVar46));
    }
    lVar46 = lVar46 + 0x70;
  }
  if (ctx->GcCompactAll != false) {
    GcCompactTransientMiscBuffers();
  }
  ctx->GcCompactAll = false;
  if ((ctx->NavWindow != (ImGuiWindow *)0x0) && (ctx->NavWindow->WasActive == false)) {
    FocusTopMostWindowUnderOne((ImGuiWindow *)0x0,(ImGuiWindow *)0x0);
  }
  ImVector<ImGuiWindowStackData>::resize(&ctx->CurrentWindowStack,0);
  ImVector<ImGuiPopupData>::resize(&ctx->BeginPopupStack,0);
  ImVector<int>::resize(&ctx->ItemFlagsStack,0);
  auVar26._12_4_ = 0;
  auVar26._0_12_ = stack0xffffffffffffff8c;
  _local_78 = (ImRect)(auVar26 << 0x20);
  ImVector<int>::push_back(&ctx->ItemFlagsStack,(int *)local_78);
  ImVector<ImGuiGroupData>::resize(&ctx->GroupStack,0);
  pIVar47 = GImGui;
  GImGui->DebugItemPickerBreakId = 0;
  if (pIVar47->DebugItemPickerActive == true) {
    uVar30 = pIVar47->HoveredIdPreviousFrame;
    pIVar47->MouseCursor = 7;
    bVar51 = IsKeyPressedMap(0xe,true);
    if (bVar51) {
      pIVar47->DebugItemPickerActive = false;
    }
    pIVar37 = GImGui;
    fVar96 = (GImGui->IO).MouseDownDuration[0];
    if ((fVar96 != 0.0) || (NAN(fVar96))) {
      uVar44 = (uint)(uVar30 == 0);
    }
    else if (uVar30 == 0) {
      uVar44 = 1;
    }
    else {
      pIVar47->DebugItemPickerBreakId = uVar30;
      pIVar47->DebugItemPickerActive = false;
      uVar44 = 0;
    }
    pIVar1 = &pIVar37->NextWindowData;
    *(byte *)&pIVar1->Flags = (byte)pIVar1->Flags | 0x40;
    (pIVar37->NextWindowData).BgAlphaVal = 0.6;
    BeginTooltip();
    Text("HoveredId: 0x%08X",(ulong)uVar30);
    Text("Press ESC to abort picking.");
    TextColored((ImVec4 *)((long)&(GImGui->Style).Colors[0].x + (ulong)(uVar44 << 4)),
                "Click to break in debugger!");
    End();
    pIVar47 = GImGui;
  }
  pIVar47->DebugHookIdInfo = 0;
  if (pIVar47->FrameCount == (pIVar47->DebugStackTool).LastActiveFrame + 1) {
    IVar40 = pIVar47->HoveredIdPreviousFrame;
    if (IVar40 == 0) {
      IVar40 = pIVar47->ActiveId;
    }
    if ((pIVar47->DebugStackTool).QueryId != IVar40) {
      (pIVar47->DebugStackTool).QueryId = IVar40;
      (pIVar47->DebugStackTool).StackLevel = -1;
      ImVector<ImGuiStackLevelInfo>::resize(&(pIVar47->DebugStackTool).Results,0);
    }
    if (IVar40 != 0) {
      uVar30 = (pIVar47->DebugStackTool).StackLevel;
      lVar46 = (long)(int)uVar30;
      if (lVar46 < 0) {
        if (uVar30 == 0xffffffff) {
          pIVar47->DebugHookIdInfo = IVar40;
        }
      }
      else {
        iVar39 = (pIVar47->DebugStackTool).Results.Size;
        if ((int)uVar30 < iVar39) {
          pIVar14 = (pIVar47->DebugStackTool).Results.Data;
          if ((pIVar14[lVar46].QuerySuccess != false) || ('\x02' < pIVar14[lVar46].QueryFrameCount))
          {
            uVar30 = uVar30 + 1;
            (pIVar47->DebugStackTool).StackLevel = uVar30;
          }
        }
        if ((int)uVar30 < iVar39) {
          pIVar14 = (pIVar47->DebugStackTool).Results.Data;
          pIVar47->DebugHookIdInfo = pIVar14[uVar30].ID;
          pIVar2 = &pIVar14[uVar30].QueryFrameCount;
          *pIVar2 = *pIVar2 + '\x01';
        }
      }
    }
  }
  ctx->WithinFrameScopeWithImplicitWindow = true;
  pIVar47 = GImGui;
  (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 2;
  (pIVar47->NextWindowData).SizeVal.x = 400.0;
  (pIVar47->NextWindowData).SizeVal.y = 400.0;
  (pIVar47->NextWindowData).SizeCond = 4;
  Begin("Debug##Default",(bool *)0x0,0);
  CallContextHooks(ctx,ImGuiContextHookType_NewFramePost);
  return;
}

Assistant:

void ImGui::NewFrame()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?");
    ImGuiContext& g = *GImGui;

    // Remove pending delete hooks before frame start.
    // This deferred removal avoid issues of removal while iterating the hook vector
    for (int n = g.Hooks.Size - 1; n >= 0; n--)
        if (g.Hooks[n].Type == ImGuiContextHookType_PendingRemoval_)
            g.Hooks.erase(&g.Hooks[n]);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePre);

    // Check and assert for various common IO and Configuration mistakes
    ErrorCheckNewFrameSanityChecks();

    // Load settings on first frame, save settings when modified (after a delay)
    UpdateSettings();

    g.Time += g.IO.DeltaTime;
    g.WithinFrameScope = true;
    g.FrameCount += 1;
    g.TooltipOverrideCount = 0;
    g.WindowsActiveCount = 0;
    g.MenusIdSubmittedThisFrame.resize(0);

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.FramerateSecPerFrameCount = ImMin(g.FramerateSecPerFrameCount + 1, IM_ARRAYSIZE(g.FramerateSecPerFrame));
    g.IO.Framerate = (g.FramerateSecPerFrameAccum > 0.0f) ? (1.0f / (g.FramerateSecPerFrameAccum / (float)g.FramerateSecPerFrameCount)) : FLT_MAX;

    UpdateViewportsNewFrame();

    // Setup current font and draw list shared data
    g.IO.Fonts->Locked = true;
    SetCurrentFont(GetDefaultFont());
    IM_ASSERT(g.Font->IsLoaded());
    ImRect virtual_space(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
    for (int n = 0; n < g.Viewports.Size; n++)
        virtual_space.Add(g.Viewports[n]->GetMainRect());
    g.DrawListSharedData.ClipRectFullscreen = virtual_space.ToVec4();
    g.DrawListSharedData.CurveTessellationTol = g.Style.CurveTessellationTol;
    g.DrawListSharedData.SetCircleTessellationMaxError(g.Style.CircleTessellationMaxError);
    g.DrawListSharedData.InitialFlags = ImDrawListFlags_None;
    if (g.Style.AntiAliasedLines)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLines;
    if (g.Style.AntiAliasedLinesUseTex && !(g.Font->ContainerAtlas->Flags & ImFontAtlasFlags_NoBakedLines))
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLinesUseTex;
    if (g.Style.AntiAliasedFill)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedFill;
    if (g.IO.BackendFlags & ImGuiBackendFlags_RendererHasVtxOffset)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AllowVtxOffset;

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it.
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataP.Clear();
    }

    // Drag and drop keep the source ID alive so even if the source disappear our state is consistent
    if (g.DragDropActive && g.DragDropPayload.SourceId == g.ActiveId)
        KeepAliveID(g.DragDropPayload.SourceId);

    // Update HoveredId data
    if (!g.HoveredIdPreviousFrame)
        g.HoveredIdTimer = 0.0f;
    if (!g.HoveredIdPreviousFrame || (g.HoveredId && g.ActiveId == g.HoveredId))
        g.HoveredIdNotActiveTimer = 0.0f;
    if (g.HoveredId)
        g.HoveredIdTimer += g.IO.DeltaTime;
    if (g.HoveredId && g.ActiveId != g.HoveredId)
        g.HoveredIdNotActiveTimer += g.IO.DeltaTime;
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredIdPreviousFrameUsingMouseWheel = g.HoveredIdUsingMouseWheel;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;
    g.HoveredIdUsingMouseWheel = false;
    g.HoveredIdDisabled = false;

    // Update ActiveId data (clear reference to active widget if the widget isn't alive anymore)
    if (g.ActiveIdIsAlive != g.ActiveId && g.ActiveIdPreviousFrame == g.ActiveId && g.ActiveId != 0)
        ClearActiveID();
    if (g.ActiveId)
        g.ActiveIdTimer += g.IO.DeltaTime;
    g.LastActiveIdTimer += g.IO.DeltaTime;
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdPreviousFrameWindow = g.ActiveIdWindow;
    g.ActiveIdPreviousFrameHasBeenEditedBefore = g.ActiveIdHasBeenEditedBefore;
    g.ActiveIdIsAlive = 0;
    g.ActiveIdHasBeenEditedThisFrame = false;
    g.ActiveIdPreviousFrameIsAlive = false;
    g.ActiveIdIsJustActivated = false;
    if (g.TempInputId != 0 && g.ActiveId != g.TempInputId)
        g.TempInputId = 0;
    if (g.ActiveId == 0)
    {
        g.ActiveIdUsingNavDirMask = 0x00;
        g.ActiveIdUsingNavInputMask = 0x00;
        g.ActiveIdUsingKeyInputMask = 0x00;
    }

    // Drag and drop
    g.DragDropAcceptIdPrev = g.DragDropAcceptIdCurr;
    g.DragDropAcceptIdCurr = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;
    g.DragDropWithinSource = false;
    g.DragDropWithinTarget = false;
    g.DragDropHoldJustPressedId = 0;

    // Close popups on focus lost (currently wip/opt-in)
    //if (g.IO.AppFocusLost)
    //    ClosePopupsExceptModals();

    // Clear buttons state when focus is lost
    // (this is useful so e.g. releasing Alt after focus loss on Alt-Tab doesn't trigger the Alt menu toggle)
    if (g.IO.AppFocusLost)
    {
        g.IO.ClearInputKeys();
        g.IO.AppFocusLost = false;
    }

    // Update keyboard input state
    // Synchronize io.KeyMods with individual modifiers io.KeyXXX bools
    g.IO.KeyMods = GetMergedKeyModFlags();
    memcpy(g.IO.KeysDownDurationPrev, g.IO.KeysDownDuration, sizeof(g.IO.KeysDownDuration));
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.KeysDown); i++)
        g.IO.KeysDownDuration[i] = g.IO.KeysDown[i] ? (g.IO.KeysDownDuration[i] < 0.0f ? 0.0f : g.IO.KeysDownDuration[i] + g.IO.DeltaTime) : -1.0f;

    // Update gamepad/keyboard navigation
    NavUpdate();

    // Update mouse input state
    UpdateMouseInputs();

    // Find hovered window
    // (needs to be before UpdateMouseMovingWindowNewFrame so we fill g.HoveredWindowUnderMovingWindow on the mouse release frame)
    UpdateHoveredWindowAndCaptureFlags();

    // Handle user moving window with mouse (at the beginning of the frame to avoid input lag or sheering)
    UpdateMouseMovingWindowNewFrame();

    // Background darkening/whitening
    if (GetTopMostPopupModal() != NULL || (g.NavWindowingTarget != NULL && g.NavWindowingHighlightAlpha > 0.0f))
        g.DimBgRatio = ImMin(g.DimBgRatio + g.IO.DeltaTime * 6.0f, 1.0f);
    else
        g.DimBgRatio = ImMax(g.DimBgRatio - g.IO.DeltaTime * 10.0f, 0.0f);

    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.WantCaptureMouseNextFrame = g.WantCaptureKeyboardNextFrame = g.WantTextInputNextFrame = -1;
    g.PlatformImePos = ImVec2(1.0f, 1.0f); // OS Input Method Editor showing on top-left of our window by default

    // Mouse wheel scrolling, scale
    UpdateMouseWheel();

    // Mark all windows as not visible and compact unused memory.
    IM_ASSERT(g.WindowsFocusOrder.Size <= g.Windows.Size);
    const float memory_compact_start_time = (g.GcCompactAll || g.IO.ConfigMemoryCompactTimer < 0.0f) ? FLT_MAX : (float)g.Time - g.IO.ConfigMemoryCompactTimer;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->BeginCount = 0;
        window->Active = false;
        window->WriteAccessed = false;

        // Garbage collect transient buffers of recently unused windows
        if (!window->WasActive && !window->MemoryCompacted && window->LastTimeActive < memory_compact_start_time)
            GcCompactTransientWindowBuffers(window);
    }

    // Garbage collect transient buffers of recently unused tables
    for (int i = 0; i < g.TablesLastTimeActive.Size; i++)
        if (g.TablesLastTimeActive[i] >= 0.0f && g.TablesLastTimeActive[i] < memory_compact_start_time)
            TableGcCompactTransientBuffers(g.Tables.GetByIndex(i));
    for (int i = 0; i < g.TablesTempData.Size; i++)
        if (g.TablesTempData[i].LastTimeActive >= 0.0f && g.TablesTempData[i].LastTimeActive < memory_compact_start_time)
            TableGcCompactTransientBuffers(&g.TablesTempData[i]);
    if (g.GcCompactAll)
        GcCompactTransientMiscBuffers();
    g.GcCompactAll = false;

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.NavWindow && !g.NavWindow->WasActive)
        FocusTopMostWindowUnderOne(NULL, NULL);

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.BeginPopupStack.resize(0);
    g.ItemFlagsStack.resize(0);
    g.ItemFlagsStack.push_back(ImGuiItemFlags_None);
    g.GroupStack.resize(0);

    // [DEBUG] Update debug features
    UpdateDebugToolItemPicker();
    UpdateDebugToolStackQueries();

    // Create implicit/fallback window - which we will only render it if the user has added something to it.
    // We don't use "Debug" to avoid colliding with user trying to create a "Debug" window with custom flags.
    // This fallback is particularly important as it avoid ImGui:: calls from crashing.
    g.WithinFrameScopeWithImplicitWindow = true;
    SetNextWindowSize(ImVec2(400, 400), ImGuiCond_FirstUseEver);
    Begin("Debug##Default");
    IM_ASSERT(g.CurrentWindow->IsFallbackWindow == true);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePost);
}